

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O2

void cdef_filter_8_2_sse4_1
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  undefined1 (*pauVar1) [16];
  char *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  undefined1 auVar12 [14];
  long lVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  short sVar39;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  ushort uVar49;
  short sVar56;
  ushort uVar57;
  short sVar58;
  ushort uVar59;
  short sVar60;
  ushort uVar61;
  short sVar62;
  ushort uVar63;
  short sVar64;
  ushort uVar65;
  short sVar66;
  ushort uVar67;
  undefined1 auVar50 [16];
  short sVar68;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  ushort uVar69;
  undefined1 in_XMM4 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar81 [16];
  ulong uVar82;
  ulong uVar83;
  undefined1 in_XMM6 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  short sVar100;
  short sVar111;
  short sVar112;
  short sVar113;
  short sVar114;
  short sVar115;
  short sVar116;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  short sVar117;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  short sVar145;
  undefined1 auVar124 [12];
  short sVar141;
  short sVar142;
  short sVar143;
  short sVar144;
  short sVar146;
  undefined1 in_XMM11 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  short sVar147;
  undefined1 in_XMM12 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  short local_88;
  short sStack_86;
  short sStack_84;
  short sStack_82;
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short sStack_70;
  short sStack_6e;
  short sStack_6c;
  short sStack_6a;
  ulong local_58;
  ushort uVar20;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  
  lVar19 = (long)dir;
  lVar13 = (long)cdef_directions_padded[lVar19 + 4][0];
  lVar14 = (long)cdef_directions_padded[lVar19 + 4][1];
  lVar17 = (long)cdef_directions_padded[lVar19][0];
  lVar19 = (long)cdef_directions_padded[lVar19][1];
  if (block_width == 8) {
    uVar15 = sec_damping;
    if (sec_strength != 0) {
      iVar11 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar11 == 0; iVar11 = iVar11 + -1) {
        }
      }
      uVar15 = sec_damping - iVar11;
      if (sec_damping < iVar11) {
        uVar15 = 0;
      }
    }
    auVar23 = pshuflw(ZEXT416((uint)sec_strength),ZEXT416((uint)sec_strength),0);
    uVar21 = auVar23._0_4_;
    auVar23 = pshuflw(ZEXT416((uint)2),ZEXT416((uint)2),0);
    local_88 = auVar23._0_2_;
    sStack_86 = auVar23._2_2_;
    auVar23 = pshuflw(ZEXT416((uint)1),ZEXT416((uint)1),0);
    uVar22 = auVar23._0_4_;
    local_58 = (ulong)uVar15;
    for (lVar18 = 0; lVar18 < block_height; lVar18 = lVar18 + 2) {
      auVar101 = *(undefined1 (*) [16])in;
      pauVar1 = (undefined1 (*) [16])((long)in + 0x120);
      auVar12 = *(undefined1 (*) [14])*pauVar1;
      sVar117 = *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 0xe);
      auVar148 = lddqu(in_XMM12,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar13 * 2));
      auVar125 = lddqu(in_XMM11,*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])((long)in + 0x120) + lVar13 * 2));
      auVar160 = lddqu(in_XMM13,*(undefined1 (*) [16])((long)in + lVar13 * -2));
      auVar70 = lddqu(in_XMM4,*(undefined1 (*) [16])((long)in + lVar13 * -2 + 0x120));
      auVar94 = lddqu(in_XMM8,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar17 * 2));
      auVar86 = lddqu(in_XMM7,*(undefined1 (*) [16])
                               (*(undefined1 (*) [16])((long)in + 0x120) + lVar17 * 2));
      auVar118 = lddqu(in_XMM10,*(undefined1 (*) [16])((long)in + lVar17 * -2));
      auVar84 = lddqu(in_XMM6,*(undefined1 (*) [16])((long)in + lVar17 * -2 + 0x120));
      sVar40 = auVar101._0_2_;
      auVar149._0_2_ = auVar148._0_2_ - sVar40;
      sVar41 = auVar101._2_2_;
      auVar149._2_2_ = auVar148._2_2_ - sVar41;
      sVar42 = auVar101._4_2_;
      auVar149._4_2_ = auVar148._4_2_ - sVar42;
      sVar43 = auVar101._6_2_;
      auVar149._6_2_ = auVar148._6_2_ - sVar43;
      sVar44 = auVar101._8_2_;
      auVar149._8_2_ = auVar148._8_2_ - sVar44;
      sVar45 = auVar101._10_2_;
      auVar149._10_2_ = auVar148._10_2_ - sVar45;
      sVar46 = auVar101._12_2_;
      auVar149._12_2_ = auVar148._12_2_ - sVar46;
      sVar47 = auVar101._14_2_;
      auVar149._14_2_ = auVar148._14_2_ - sVar47;
      auVar126._0_2_ = auVar125._0_2_ - *(short *)*pauVar1;
      auVar126._2_2_ = auVar125._2_2_ - *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 2);
      auVar126._4_2_ = auVar125._4_2_ - *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 4);
      auVar126._6_2_ = auVar125._6_2_ - *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 6);
      auVar126._8_2_ = auVar125._8_2_ - *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 8);
      auVar126._10_2_ = auVar125._10_2_ - *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 10);
      auVar126._12_2_ = auVar125._12_2_ - *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 0xc)
      ;
      auVar126._14_2_ = auVar125._14_2_ - sVar117;
      auVar170 = pabsw(in_XMM14,auVar149);
      auVar150 = psraw(auVar149,0xf);
      uVar20 = auVar170._0_2_;
      auVar24._0_2_ = uVar20 >> local_58;
      uVar32 = auVar170._2_2_;
      auVar24._2_2_ = uVar32 >> local_58;
      uVar33 = auVar170._4_2_;
      auVar24._4_2_ = uVar33 >> local_58;
      uVar34 = auVar170._6_2_;
      auVar24._6_2_ = uVar34 >> local_58;
      uVar35 = auVar170._8_2_;
      auVar24._8_2_ = uVar35 >> local_58;
      uVar36 = auVar170._10_2_;
      auVar24._10_2_ = uVar36 >> local_58;
      uVar37 = auVar170._12_2_;
      uVar38 = auVar170._14_2_;
      auVar24._12_2_ = uVar37 >> local_58;
      auVar24._14_2_ = uVar38 >> local_58;
      auVar148 = pabsw(auVar101,auVar126);
      uVar49 = auVar148._0_2_;
      auVar179._0_2_ = uVar49 >> local_58;
      uVar57 = auVar148._2_2_;
      auVar179._2_2_ = uVar57 >> local_58;
      uVar59 = auVar148._4_2_;
      auVar179._4_2_ = uVar59 >> local_58;
      uVar61 = auVar148._6_2_;
      auVar179._6_2_ = uVar61 >> local_58;
      uVar63 = auVar148._8_2_;
      auVar179._8_2_ = uVar63 >> local_58;
      uVar65 = auVar148._10_2_;
      auVar179._10_2_ = uVar65 >> local_58;
      uVar67 = auVar148._12_2_;
      uVar69 = auVar148._14_2_;
      auVar179._12_2_ = uVar67 >> local_58;
      auVar179._14_2_ = uVar69 >> local_58;
      auVar127 = psraw(auVar126,0xf);
      auVar101._4_4_ = uVar21;
      auVar101._0_4_ = uVar21;
      auVar101._8_4_ = uVar21;
      auVar101._12_4_ = uVar21;
      auVar50 = psubusw(auVar101,auVar24);
      auVar125 = psubusw(auVar101,auVar179);
      sVar48 = auVar50._0_2_;
      sVar56 = auVar50._2_2_;
      sVar58 = auVar50._4_2_;
      sVar60 = auVar50._6_2_;
      sVar62 = auVar50._8_2_;
      sVar64 = auVar50._10_2_;
      sVar66 = auVar50._12_2_;
      sVar68 = auVar50._14_2_;
      sVar141 = auVar125._0_2_;
      sVar142 = auVar125._2_2_;
      sVar143 = auVar125._4_2_;
      sVar144 = auVar125._6_2_;
      sVar145 = auVar125._8_2_;
      sVar146 = auVar125._10_2_;
      sVar147 = auVar125._12_2_;
      sVar39 = auVar125._14_2_;
      auVar51._0_2_ =
           (((short)uVar20 < sVar48) * uVar20 | (ushort)((short)uVar20 >= sVar48) * sVar48) +
           auVar150._0_2_;
      auVar51._2_2_ =
           (((short)uVar32 < sVar56) * uVar32 | (ushort)((short)uVar32 >= sVar56) * sVar56) +
           auVar150._2_2_;
      auVar51._4_2_ =
           (((short)uVar33 < sVar58) * uVar33 | (ushort)((short)uVar33 >= sVar58) * sVar58) +
           auVar150._4_2_;
      auVar51._6_2_ =
           (((short)uVar34 < sVar60) * uVar34 | (ushort)((short)uVar34 >= sVar60) * sVar60) +
           auVar150._6_2_;
      auVar51._8_2_ =
           (((short)uVar35 < sVar62) * uVar35 | (ushort)((short)uVar35 >= sVar62) * sVar62) +
           auVar150._8_2_;
      auVar51._10_2_ =
           (((short)uVar36 < sVar64) * uVar36 | (ushort)((short)uVar36 >= sVar64) * sVar64) +
           auVar150._10_2_;
      auVar51._12_2_ =
           (((short)uVar37 < sVar66) * uVar37 | (ushort)((short)uVar37 >= sVar66) * sVar66) +
           auVar150._12_2_;
      auVar51._14_2_ =
           (((short)uVar38 < sVar68) * uVar38 | (ushort)((short)uVar38 >= sVar68) * sVar68) +
           auVar150._14_2_;
      auVar25._0_2_ =
           (((short)uVar49 < sVar141) * uVar49 | (ushort)((short)uVar49 >= sVar141) * sVar141) +
           auVar127._0_2_;
      auVar25._2_2_ =
           (((short)uVar57 < sVar142) * uVar57 | (ushort)((short)uVar57 >= sVar142) * sVar142) +
           auVar127._2_2_;
      auVar25._4_2_ =
           (((short)uVar59 < sVar143) * uVar59 | (ushort)((short)uVar59 >= sVar143) * sVar143) +
           auVar127._4_2_;
      auVar25._6_2_ =
           (((short)uVar61 < sVar144) * uVar61 | (ushort)((short)uVar61 >= sVar144) * sVar144) +
           auVar127._6_2_;
      auVar25._8_2_ =
           (((short)uVar63 < sVar145) * uVar63 | (ushort)((short)uVar63 >= sVar145) * sVar145) +
           auVar127._8_2_;
      auVar25._10_2_ =
           (((short)uVar65 < sVar146) * uVar65 | (ushort)((short)uVar65 >= sVar146) * sVar146) +
           auVar127._10_2_;
      auVar25._12_2_ =
           (((short)uVar67 < sVar147) * uVar67 | (ushort)((short)uVar67 >= sVar147) * sVar147) +
           auVar127._12_2_;
      auVar25._14_2_ =
           (((short)uVar69 < sVar39) * uVar69 | (ushort)((short)uVar69 >= sVar39) * sVar39) +
           auVar127._14_2_;
      auVar51 = auVar51 ^ auVar150;
      auVar25 = auVar25 ^ auVar127;
      auVar161._0_2_ = auVar160._0_2_ - sVar40;
      auVar161._2_2_ = auVar160._2_2_ - sVar41;
      auVar161._4_2_ = auVar160._4_2_ - sVar42;
      auVar161._6_2_ = auVar160._6_2_ - sVar43;
      auVar161._8_2_ = auVar160._8_2_ - sVar44;
      auVar161._10_2_ = auVar160._10_2_ - sVar45;
      auVar161._12_2_ = auVar160._12_2_ - sVar46;
      auVar161._14_2_ = auVar160._14_2_ - sVar47;
      sVar100 = auVar12._0_2_;
      auVar71._0_2_ = auVar70._0_2_ - sVar100;
      sVar111 = auVar12._2_2_;
      auVar71._2_2_ = auVar70._2_2_ - sVar111;
      sVar112 = auVar12._4_2_;
      auVar71._4_2_ = auVar70._4_2_ - sVar112;
      sVar113 = auVar12._6_2_;
      auVar71._6_2_ = auVar70._6_2_ - sVar113;
      sVar114 = auVar12._8_2_;
      auVar71._8_2_ = auVar70._8_2_ - sVar114;
      sVar115 = auVar12._10_2_;
      auVar71._10_2_ = auVar70._10_2_ - sVar115;
      sVar116 = auVar12._12_2_;
      auVar71._12_2_ = auVar70._12_2_ - sVar116;
      auVar71._14_2_ = auVar70._14_2_ - sVar117;
      auVar125 = pabsw(auVar148,auVar161);
      auVar127 = psraw(auVar161,0xf);
      auVar148 = pabsw(auVar170,auVar71);
      auVar50 = psraw(auVar71,0xf);
      uVar20 = auVar125._0_2_;
      auVar128._0_2_ = uVar20 >> local_58;
      uVar32 = auVar125._2_2_;
      auVar128._2_2_ = uVar32 >> local_58;
      uVar33 = auVar125._4_2_;
      auVar128._4_2_ = uVar33 >> local_58;
      uVar34 = auVar125._6_2_;
      auVar128._6_2_ = uVar34 >> local_58;
      uVar35 = auVar125._8_2_;
      auVar128._8_2_ = uVar35 >> local_58;
      uVar36 = auVar125._10_2_;
      auVar128._10_2_ = uVar36 >> local_58;
      uVar37 = auVar125._12_2_;
      uVar38 = auVar125._14_2_;
      auVar128._12_2_ = uVar37 >> local_58;
      auVar128._14_2_ = uVar38 >> local_58;
      uVar49 = auVar148._0_2_;
      auVar180._0_2_ = uVar49 >> local_58;
      uVar57 = auVar148._2_2_;
      auVar180._2_2_ = uVar57 >> local_58;
      uVar59 = auVar148._4_2_;
      auVar180._4_2_ = uVar59 >> local_58;
      uVar61 = auVar148._6_2_;
      auVar180._6_2_ = uVar61 >> local_58;
      uVar63 = auVar148._8_2_;
      auVar180._8_2_ = uVar63 >> local_58;
      uVar65 = auVar148._10_2_;
      auVar180._10_2_ = uVar65 >> local_58;
      uVar67 = auVar148._12_2_;
      uVar69 = auVar148._14_2_;
      auVar180._12_2_ = uVar67 >> local_58;
      auVar180._14_2_ = uVar69 >> local_58;
      auVar70 = psubusw(auVar101,auVar128);
      auVar148 = psubusw(auVar101,auVar180);
      sVar48 = auVar70._0_2_;
      sVar56 = auVar70._2_2_;
      sVar58 = auVar70._4_2_;
      sVar60 = auVar70._6_2_;
      sVar62 = auVar70._8_2_;
      sVar64 = auVar70._10_2_;
      sVar66 = auVar70._12_2_;
      sVar68 = auVar70._14_2_;
      sVar141 = auVar148._0_2_;
      sVar142 = auVar148._2_2_;
      sVar143 = auVar148._4_2_;
      sVar144 = auVar148._6_2_;
      sVar145 = auVar148._8_2_;
      sVar146 = auVar148._10_2_;
      sVar147 = auVar148._12_2_;
      sVar39 = auVar148._14_2_;
      auVar151._0_2_ =
           (((short)uVar20 < sVar48) * uVar20 | (ushort)((short)uVar20 >= sVar48) * sVar48) +
           auVar127._0_2_;
      auVar151._2_2_ =
           (((short)uVar32 < sVar56) * uVar32 | (ushort)((short)uVar32 >= sVar56) * sVar56) +
           auVar127._2_2_;
      auVar151._4_2_ =
           (((short)uVar33 < sVar58) * uVar33 | (ushort)((short)uVar33 >= sVar58) * sVar58) +
           auVar127._4_2_;
      auVar151._6_2_ =
           (((short)uVar34 < sVar60) * uVar34 | (ushort)((short)uVar34 >= sVar60) * sVar60) +
           auVar127._6_2_;
      auVar151._8_2_ =
           (((short)uVar35 < sVar62) * uVar35 | (ushort)((short)uVar35 >= sVar62) * sVar62) +
           auVar127._8_2_;
      auVar151._10_2_ =
           (((short)uVar36 < sVar64) * uVar36 | (ushort)((short)uVar36 >= sVar64) * sVar64) +
           auVar127._10_2_;
      auVar151._12_2_ =
           (((short)uVar37 < sVar66) * uVar37 | (ushort)((short)uVar37 >= sVar66) * sVar66) +
           auVar127._12_2_;
      auVar151._14_2_ =
           (((short)uVar38 < sVar68) * uVar38 | (ushort)((short)uVar38 >= sVar68) * sVar68) +
           auVar127._14_2_;
      auVar129._0_2_ =
           (((short)uVar49 < sVar141) * uVar49 | (ushort)((short)uVar49 >= sVar141) * sVar141) +
           auVar50._0_2_;
      auVar129._2_2_ =
           (((short)uVar57 < sVar142) * uVar57 | (ushort)((short)uVar57 >= sVar142) * sVar142) +
           auVar50._2_2_;
      auVar129._4_2_ =
           (((short)uVar59 < sVar143) * uVar59 | (ushort)((short)uVar59 >= sVar143) * sVar143) +
           auVar50._4_2_;
      auVar129._6_2_ =
           (((short)uVar61 < sVar144) * uVar61 | (ushort)((short)uVar61 >= sVar144) * sVar144) +
           auVar50._6_2_;
      auVar129._8_2_ =
           (((short)uVar63 < sVar145) * uVar63 | (ushort)((short)uVar63 >= sVar145) * sVar145) +
           auVar50._8_2_;
      auVar129._10_2_ =
           (((short)uVar65 < sVar146) * uVar65 | (ushort)((short)uVar65 >= sVar146) * sVar146) +
           auVar50._10_2_;
      auVar129._12_2_ =
           (((short)uVar67 < sVar147) * uVar67 | (ushort)((short)uVar67 >= sVar147) * sVar147) +
           auVar50._12_2_;
      auVar129._14_2_ =
           (((short)uVar69 < sVar39) * uVar69 | (ushort)((short)uVar69 >= sVar39) * sVar39) +
           auVar50._14_2_;
      auVar151 = auVar151 ^ auVar127;
      auVar152._0_2_ = auVar151._0_2_ + auVar51._0_2_;
      auVar152._2_2_ = auVar151._2_2_ + auVar51._2_2_;
      auVar152._4_2_ = auVar151._4_2_ + auVar51._4_2_;
      auVar152._6_2_ = auVar151._6_2_ + auVar51._6_2_;
      auVar152._8_2_ = auVar151._8_2_ + auVar51._8_2_;
      auVar152._10_2_ = auVar151._10_2_ + auVar51._10_2_;
      auVar152._12_2_ = auVar151._12_2_ + auVar51._12_2_;
      auVar152._14_2_ = auVar151._14_2_ + auVar51._14_2_;
      auVar129 = auVar129 ^ auVar50;
      auVar130._0_2_ = auVar129._0_2_ + auVar25._0_2_;
      auVar130._2_2_ = auVar129._2_2_ + auVar25._2_2_;
      auVar130._4_2_ = auVar129._4_2_ + auVar25._4_2_;
      auVar130._6_2_ = auVar129._6_2_ + auVar25._6_2_;
      auVar130._8_2_ = auVar129._8_2_ + auVar25._8_2_;
      auVar130._10_2_ = auVar129._10_2_ + auVar25._10_2_;
      auVar130._12_2_ = auVar129._12_2_ + auVar25._12_2_;
      auVar130._14_2_ = auVar129._14_2_ + auVar25._14_2_;
      auVar95._0_2_ = auVar94._0_2_ - sVar40;
      auVar95._2_2_ = auVar94._2_2_ - sVar41;
      auVar95._4_2_ = auVar94._4_2_ - sVar42;
      auVar95._6_2_ = auVar94._6_2_ - sVar43;
      auVar95._8_2_ = auVar94._8_2_ - sVar44;
      auVar95._10_2_ = auVar94._10_2_ - sVar45;
      auVar95._12_2_ = auVar94._12_2_ - sVar46;
      auVar95._14_2_ = auVar94._14_2_ - sVar47;
      auVar87._0_2_ = auVar86._0_2_ - sVar100;
      auVar87._2_2_ = auVar86._2_2_ - sVar111;
      auVar87._4_2_ = auVar86._4_2_ - sVar112;
      auVar87._6_2_ = auVar86._6_2_ - sVar113;
      auVar87._8_2_ = auVar86._8_2_ - sVar114;
      auVar87._10_2_ = auVar86._10_2_ - sVar115;
      auVar87._12_2_ = auVar86._12_2_ - sVar116;
      auVar87._14_2_ = auVar86._14_2_ - sVar117;
      auVar148 = pabsw(auVar125,auVar95);
      auVar86 = psraw(auVar95,0xf);
      auVar125 = pabsw(auVar50,auVar87);
      auVar70 = psraw(auVar87,0xf);
      uVar20 = auVar148._0_2_;
      auVar26._0_2_ = uVar20 >> local_58;
      uVar32 = auVar148._2_2_;
      auVar26._2_2_ = uVar32 >> local_58;
      uVar33 = auVar148._4_2_;
      auVar26._4_2_ = uVar33 >> local_58;
      uVar34 = auVar148._6_2_;
      auVar26._6_2_ = uVar34 >> local_58;
      uVar35 = auVar148._8_2_;
      auVar26._8_2_ = uVar35 >> local_58;
      uVar36 = auVar148._10_2_;
      auVar26._10_2_ = uVar36 >> local_58;
      uVar37 = auVar148._12_2_;
      uVar38 = auVar148._14_2_;
      auVar26._12_2_ = uVar37 >> local_58;
      auVar26._14_2_ = uVar38 >> local_58;
      uVar49 = auVar125._0_2_;
      auVar162._0_2_ = uVar49 >> local_58;
      uVar57 = auVar125._2_2_;
      auVar162._2_2_ = uVar57 >> local_58;
      uVar59 = auVar125._4_2_;
      auVar162._4_2_ = uVar59 >> local_58;
      uVar61 = auVar125._6_2_;
      auVar162._6_2_ = uVar61 >> local_58;
      uVar63 = auVar125._8_2_;
      auVar162._8_2_ = uVar63 >> local_58;
      uVar65 = auVar125._10_2_;
      auVar162._10_2_ = uVar65 >> local_58;
      uVar67 = auVar125._12_2_;
      uVar69 = auVar125._14_2_;
      auVar162._12_2_ = uVar67 >> local_58;
      auVar162._14_2_ = uVar69 >> local_58;
      auVar50 = psubusw(auVar101,auVar26);
      auVar125 = psubusw(auVar101,auVar162);
      sVar48 = auVar50._0_2_;
      sVar56 = auVar50._2_2_;
      sVar58 = auVar50._4_2_;
      sVar60 = auVar50._6_2_;
      sVar62 = auVar50._8_2_;
      sVar64 = auVar50._10_2_;
      sVar66 = auVar50._12_2_;
      sVar68 = auVar50._14_2_;
      sVar141 = auVar125._0_2_;
      sVar142 = auVar125._2_2_;
      sVar143 = auVar125._4_2_;
      sVar144 = auVar125._6_2_;
      sVar145 = auVar125._8_2_;
      sVar146 = auVar125._10_2_;
      sVar147 = auVar125._12_2_;
      sVar39 = auVar125._14_2_;
      auVar52._0_2_ =
           (((short)uVar20 < sVar48) * uVar20 | (ushort)((short)uVar20 >= sVar48) * sVar48) +
           auVar86._0_2_;
      auVar52._2_2_ =
           (((short)uVar32 < sVar56) * uVar32 | (ushort)((short)uVar32 >= sVar56) * sVar56) +
           auVar86._2_2_;
      auVar52._4_2_ =
           (((short)uVar33 < sVar58) * uVar33 | (ushort)((short)uVar33 >= sVar58) * sVar58) +
           auVar86._4_2_;
      auVar52._6_2_ =
           (((short)uVar34 < sVar60) * uVar34 | (ushort)((short)uVar34 >= sVar60) * sVar60) +
           auVar86._6_2_;
      auVar52._8_2_ =
           (((short)uVar35 < sVar62) * uVar35 | (ushort)((short)uVar35 >= sVar62) * sVar62) +
           auVar86._8_2_;
      auVar52._10_2_ =
           (((short)uVar36 < sVar64) * uVar36 | (ushort)((short)uVar36 >= sVar64) * sVar64) +
           auVar86._10_2_;
      auVar52._12_2_ =
           (((short)uVar37 < sVar66) * uVar37 | (ushort)((short)uVar37 >= sVar66) * sVar66) +
           auVar86._12_2_;
      auVar52._14_2_ =
           (((short)uVar38 < sVar68) * uVar38 | (ushort)((short)uVar38 >= sVar68) * sVar68) +
           auVar86._14_2_;
      auVar27._0_2_ =
           (((short)uVar49 < sVar141) * uVar49 | (ushort)((short)uVar49 >= sVar141) * sVar141) +
           auVar70._0_2_;
      auVar27._2_2_ =
           (((short)uVar57 < sVar142) * uVar57 | (ushort)((short)uVar57 >= sVar142) * sVar142) +
           auVar70._2_2_;
      auVar27._4_2_ =
           (((short)uVar59 < sVar143) * uVar59 | (ushort)((short)uVar59 >= sVar143) * sVar143) +
           auVar70._4_2_;
      auVar27._6_2_ =
           (((short)uVar61 < sVar144) * uVar61 | (ushort)((short)uVar61 >= sVar144) * sVar144) +
           auVar70._6_2_;
      auVar27._8_2_ =
           (((short)uVar63 < sVar145) * uVar63 | (ushort)((short)uVar63 >= sVar145) * sVar145) +
           auVar70._8_2_;
      auVar27._10_2_ =
           (((short)uVar65 < sVar146) * uVar65 | (ushort)((short)uVar65 >= sVar146) * sVar146) +
           auVar70._10_2_;
      auVar27._12_2_ =
           (((short)uVar67 < sVar147) * uVar67 | (ushort)((short)uVar67 >= sVar147) * sVar147) +
           auVar70._12_2_;
      auVar27._14_2_ =
           (((short)uVar69 < sVar39) * uVar69 | (ushort)((short)uVar69 >= sVar39) * sVar39) +
           auVar70._14_2_;
      auVar52 = auVar52 ^ auVar86;
      auVar27 = auVar27 ^ auVar70;
      auVar119._0_2_ = auVar118._0_2_ - sVar40;
      auVar119._2_2_ = auVar118._2_2_ - sVar41;
      auVar119._4_2_ = auVar118._4_2_ - sVar42;
      auVar119._6_2_ = auVar118._6_2_ - sVar43;
      auVar119._8_2_ = auVar118._8_2_ - sVar44;
      auVar119._10_2_ = auVar118._10_2_ - sVar45;
      auVar119._12_2_ = auVar118._12_2_ - sVar46;
      auVar119._14_2_ = auVar118._14_2_ - sVar47;
      auVar85._0_2_ = auVar84._0_2_ - sVar100;
      auVar85._2_2_ = auVar84._2_2_ - sVar111;
      auVar85._4_2_ = auVar84._4_2_ - sVar112;
      auVar85._6_2_ = auVar84._6_2_ - sVar113;
      auVar85._8_2_ = auVar84._8_2_ - sVar114;
      auVar85._10_2_ = auVar84._10_2_ - sVar115;
      auVar85._12_2_ = auVar84._12_2_ - sVar116;
      auVar85._14_2_ = auVar84._14_2_ - sVar117;
      auVar148 = pabsw(auVar148,auVar119);
      auVar86 = psraw(auVar119,0xf);
      uVar20 = auVar148._0_2_;
      auVar72._0_2_ = uVar20 >> local_58;
      uVar32 = auVar148._2_2_;
      auVar72._2_2_ = uVar32 >> local_58;
      uVar33 = auVar148._4_2_;
      auVar72._4_2_ = uVar33 >> local_58;
      uVar34 = auVar148._6_2_;
      auVar72._6_2_ = uVar34 >> local_58;
      uVar35 = auVar148._8_2_;
      auVar72._8_2_ = uVar35 >> local_58;
      uVar36 = auVar148._10_2_;
      auVar72._10_2_ = uVar36 >> local_58;
      uVar37 = auVar148._12_2_;
      uVar38 = auVar148._14_2_;
      auVar72._12_2_ = uVar37 >> local_58;
      auVar72._14_2_ = uVar38 >> local_58;
      auVar94 = pabsw(auVar162,auVar85);
      uVar49 = auVar94._0_2_;
      auVar171._0_2_ = uVar49 >> local_58;
      uVar57 = auVar94._2_2_;
      auVar171._2_2_ = uVar57 >> local_58;
      uVar59 = auVar94._4_2_;
      auVar171._4_2_ = uVar59 >> local_58;
      uVar61 = auVar94._6_2_;
      auVar171._6_2_ = uVar61 >> local_58;
      uVar63 = auVar94._8_2_;
      auVar171._8_2_ = uVar63 >> local_58;
      uVar65 = auVar94._10_2_;
      auVar171._10_2_ = uVar65 >> local_58;
      uVar67 = auVar94._12_2_;
      uVar69 = auVar94._14_2_;
      auVar171._12_2_ = uVar67 >> local_58;
      auVar171._14_2_ = uVar69 >> local_58;
      auVar125 = psraw(auVar85,0xf);
      auVar70 = psubusw(auVar101,auVar72);
      auVar50 = psubusw(auVar101,auVar171);
      sVar48 = auVar70._0_2_;
      sVar56 = auVar70._2_2_;
      sVar58 = auVar70._4_2_;
      sVar60 = auVar70._6_2_;
      sVar62 = auVar70._8_2_;
      sVar64 = auVar70._10_2_;
      sVar66 = auVar70._12_2_;
      sVar68 = auVar70._14_2_;
      sVar141 = auVar50._0_2_;
      sVar142 = auVar50._2_2_;
      sVar143 = auVar50._4_2_;
      sVar144 = auVar50._6_2_;
      sVar145 = auVar50._8_2_;
      sVar146 = auVar50._10_2_;
      sVar147 = auVar50._12_2_;
      sVar39 = auVar50._14_2_;
      auVar96._0_2_ =
           (((short)uVar20 < sVar48) * uVar20 | (ushort)((short)uVar20 >= sVar48) * sVar48) +
           auVar86._0_2_;
      auVar96._2_2_ =
           (((short)uVar32 < sVar56) * uVar32 | (ushort)((short)uVar32 >= sVar56) * sVar56) +
           auVar86._2_2_;
      auVar96._4_2_ =
           (((short)uVar33 < sVar58) * uVar33 | (ushort)((short)uVar33 >= sVar58) * sVar58) +
           auVar86._4_2_;
      auVar96._6_2_ =
           (((short)uVar34 < sVar60) * uVar34 | (ushort)((short)uVar34 >= sVar60) * sVar60) +
           auVar86._6_2_;
      auVar96._8_2_ =
           (((short)uVar35 < sVar62) * uVar35 | (ushort)((short)uVar35 >= sVar62) * sVar62) +
           auVar86._8_2_;
      auVar96._10_2_ =
           (((short)uVar36 < sVar64) * uVar36 | (ushort)((short)uVar36 >= sVar64) * sVar64) +
           auVar86._10_2_;
      auVar96._12_2_ =
           (((short)uVar37 < sVar66) * uVar37 | (ushort)((short)uVar37 >= sVar66) * sVar66) +
           auVar86._12_2_;
      auVar96._14_2_ =
           (((short)uVar38 < sVar68) * uVar38 | (ushort)((short)uVar38 >= sVar68) * sVar68) +
           auVar86._14_2_;
      auVar88._0_2_ =
           (((short)uVar49 < sVar141) * uVar49 | (ushort)((short)uVar49 >= sVar141) * sVar141) +
           auVar125._0_2_;
      auVar88._2_2_ =
           (((short)uVar57 < sVar142) * uVar57 | (ushort)((short)uVar57 >= sVar142) * sVar142) +
           auVar125._2_2_;
      auVar88._4_2_ =
           (((short)uVar59 < sVar143) * uVar59 | (ushort)((short)uVar59 >= sVar143) * sVar143) +
           auVar125._4_2_;
      auVar88._6_2_ =
           (((short)uVar61 < sVar144) * uVar61 | (ushort)((short)uVar61 >= sVar144) * sVar144) +
           auVar125._6_2_;
      auVar88._8_2_ =
           (((short)uVar63 < sVar145) * uVar63 | (ushort)((short)uVar63 >= sVar145) * sVar145) +
           auVar125._8_2_;
      auVar88._10_2_ =
           (((short)uVar65 < sVar146) * uVar65 | (ushort)((short)uVar65 >= sVar146) * sVar146) +
           auVar125._10_2_;
      auVar88._12_2_ =
           (((short)uVar67 < sVar147) * uVar67 | (ushort)((short)uVar67 >= sVar147) * sVar147) +
           auVar125._12_2_;
      auVar88._14_2_ =
           (((short)uVar69 < sVar39) * uVar69 | (ushort)((short)uVar69 >= sVar39) * sVar39) +
           auVar125._14_2_;
      auVar96 = auVar96 ^ auVar86;
      auVar88 = auVar88 ^ auVar125;
      auVar70 = lddqu(auVar152,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar14 * 2));
      auVar50 = lddqu(auVar130,*(undefined1 (*) [16])
                                (*(undefined1 (*) [16])((long)in + 0x120) + lVar14 * 2));
      auVar84 = lddqu(auVar72,*(undefined1 (*) [16])((long)in + lVar14 * -2));
      auVar127 = lddqu(auVar180,*(undefined1 (*) [16])((long)in + lVar14 * -2 + 0x120));
      auVar86 = lddqu(auVar86,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar19 * 2));
      auVar125 = lddqu(auVar27,*(undefined1 (*) [16])
                                (*(undefined1 (*) [16])((long)in + 0x120) + lVar19 * 2));
      auVar153._0_2_ = auVar70._0_2_ - sVar40;
      auVar153._2_2_ = auVar70._2_2_ - sVar41;
      auVar153._4_2_ = auVar70._4_2_ - sVar42;
      auVar153._6_2_ = auVar70._6_2_ - sVar43;
      auVar153._8_2_ = auVar70._8_2_ - sVar44;
      auVar153._10_2_ = auVar70._10_2_ - sVar45;
      auVar153._12_2_ = auVar70._12_2_ - sVar46;
      auVar153._14_2_ = auVar70._14_2_ - sVar47;
      auVar131._0_2_ = auVar50._0_2_ - sVar100;
      auVar131._2_2_ = auVar50._2_2_ - sVar111;
      auVar131._4_2_ = auVar50._4_2_ - sVar112;
      auVar131._6_2_ = auVar50._6_2_ - sVar113;
      auVar131._8_2_ = auVar50._8_2_ - sVar114;
      auVar131._10_2_ = auVar50._10_2_ - sVar115;
      auVar131._12_2_ = auVar50._12_2_ - sVar116;
      auVar131._14_2_ = auVar50._14_2_ - sVar117;
      auVar50 = pabsw(auVar148,auVar153);
      auVar118 = psraw(auVar153,0xf);
      uVar20 = auVar50._0_2_;
      auVar28._0_2_ = uVar20 >> local_58;
      uVar32 = auVar50._2_2_;
      auVar28._2_2_ = uVar32 >> local_58;
      uVar33 = auVar50._4_2_;
      auVar28._4_2_ = uVar33 >> local_58;
      uVar34 = auVar50._6_2_;
      auVar28._6_2_ = uVar34 >> local_58;
      uVar35 = auVar50._8_2_;
      auVar28._8_2_ = uVar35 >> local_58;
      uVar36 = auVar50._10_2_;
      auVar28._10_2_ = uVar36 >> local_58;
      uVar37 = auVar50._12_2_;
      uVar38 = auVar50._14_2_;
      auVar28._12_2_ = uVar37 >> local_58;
      auVar28._14_2_ = uVar38 >> local_58;
      auVar148 = pabsw(auVar94,auVar131);
      uVar49 = auVar148._0_2_;
      auVar172._0_2_ = uVar49 >> local_58;
      uVar57 = auVar148._2_2_;
      auVar172._2_2_ = uVar57 >> local_58;
      uVar59 = auVar148._4_2_;
      auVar172._4_2_ = uVar59 >> local_58;
      uVar61 = auVar148._6_2_;
      auVar172._6_2_ = uVar61 >> local_58;
      uVar63 = auVar148._8_2_;
      auVar172._8_2_ = uVar63 >> local_58;
      uVar65 = auVar148._10_2_;
      auVar172._10_2_ = uVar65 >> local_58;
      uVar67 = auVar148._12_2_;
      uVar69 = auVar148._14_2_;
      auVar172._12_2_ = uVar67 >> local_58;
      auVar172._14_2_ = uVar69 >> local_58;
      auVar94 = psraw(auVar131,0xf);
      auVar70 = psubusw(auVar101,auVar28);
      auVar148 = psubusw(auVar101,auVar172);
      sVar48 = auVar70._0_2_;
      sVar56 = auVar70._2_2_;
      sVar58 = auVar70._4_2_;
      sVar60 = auVar70._6_2_;
      sVar62 = auVar70._8_2_;
      sVar64 = auVar70._10_2_;
      sVar66 = auVar70._12_2_;
      sVar68 = auVar70._14_2_;
      sVar141 = auVar148._0_2_;
      sVar142 = auVar148._2_2_;
      sVar143 = auVar148._4_2_;
      sVar144 = auVar148._6_2_;
      sVar145 = auVar148._8_2_;
      sVar146 = auVar148._10_2_;
      sVar147 = auVar148._12_2_;
      sVar39 = auVar148._14_2_;
      auVar53._0_2_ =
           (((short)uVar20 < sVar48) * uVar20 | (ushort)((short)uVar20 >= sVar48) * sVar48) +
           auVar118._0_2_;
      auVar53._2_2_ =
           (((short)uVar32 < sVar56) * uVar32 | (ushort)((short)uVar32 >= sVar56) * sVar56) +
           auVar118._2_2_;
      auVar53._4_2_ =
           (((short)uVar33 < sVar58) * uVar33 | (ushort)((short)uVar33 >= sVar58) * sVar58) +
           auVar118._4_2_;
      auVar53._6_2_ =
           (((short)uVar34 < sVar60) * uVar34 | (ushort)((short)uVar34 >= sVar60) * sVar60) +
           auVar118._6_2_;
      auVar53._8_2_ =
           (((short)uVar35 < sVar62) * uVar35 | (ushort)((short)uVar35 >= sVar62) * sVar62) +
           auVar118._8_2_;
      auVar53._10_2_ =
           (((short)uVar36 < sVar64) * uVar36 | (ushort)((short)uVar36 >= sVar64) * sVar64) +
           auVar118._10_2_;
      auVar53._12_2_ =
           (((short)uVar37 < sVar66) * uVar37 | (ushort)((short)uVar37 >= sVar66) * sVar66) +
           auVar118._12_2_;
      auVar53._14_2_ =
           (((short)uVar38 < sVar68) * uVar38 | (ushort)((short)uVar38 >= sVar68) * sVar68) +
           auVar118._14_2_;
      auVar29._0_2_ =
           (((short)uVar49 < sVar141) * uVar49 | (ushort)((short)uVar49 >= sVar141) * sVar141) +
           auVar94._0_2_;
      auVar29._2_2_ =
           (((short)uVar57 < sVar142) * uVar57 | (ushort)((short)uVar57 >= sVar142) * sVar142) +
           auVar94._2_2_;
      auVar29._4_2_ =
           (((short)uVar59 < sVar143) * uVar59 | (ushort)((short)uVar59 >= sVar143) * sVar143) +
           auVar94._4_2_;
      auVar29._6_2_ =
           (((short)uVar61 < sVar144) * uVar61 | (ushort)((short)uVar61 >= sVar144) * sVar144) +
           auVar94._6_2_;
      auVar29._8_2_ =
           (((short)uVar63 < sVar145) * uVar63 | (ushort)((short)uVar63 >= sVar145) * sVar145) +
           auVar94._8_2_;
      auVar29._10_2_ =
           (((short)uVar65 < sVar146) * uVar65 | (ushort)((short)uVar65 >= sVar146) * sVar146) +
           auVar94._10_2_;
      auVar29._12_2_ =
           (((short)uVar67 < sVar147) * uVar67 | (ushort)((short)uVar67 >= sVar147) * sVar147) +
           auVar94._12_2_;
      auVar29._14_2_ =
           (((short)uVar69 < sVar39) * uVar69 | (ushort)((short)uVar69 >= sVar39) * sVar39) +
           auVar94._14_2_;
      auVar53 = auVar53 ^ auVar118;
      auVar73._0_2_ = auVar84._0_2_ - sVar40;
      auVar73._2_2_ = auVar84._2_2_ - sVar41;
      auVar73._4_2_ = auVar84._4_2_ - sVar42;
      auVar73._6_2_ = auVar84._6_2_ - sVar43;
      auVar73._8_2_ = auVar84._8_2_ - sVar44;
      auVar73._10_2_ = auVar84._10_2_ - sVar45;
      auVar73._12_2_ = auVar84._12_2_ - sVar46;
      auVar73._14_2_ = auVar84._14_2_ - sVar47;
      auVar181._0_2_ = auVar127._0_2_ - sVar100;
      auVar181._2_2_ = auVar127._2_2_ - sVar111;
      auVar181._4_2_ = auVar127._4_2_ - sVar112;
      auVar181._6_2_ = auVar127._6_2_ - sVar113;
      auVar181._8_2_ = auVar127._8_2_ - sVar114;
      auVar181._10_2_ = auVar127._10_2_ - sVar115;
      auVar181._12_2_ = auVar127._12_2_ - sVar116;
      auVar181._14_2_ = auVar127._14_2_ - sVar117;
      auVar148 = pabsw(auVar50,auVar73);
      uVar20 = auVar148._0_2_;
      auVar163._0_2_ = uVar20 >> local_58;
      uVar32 = auVar148._2_2_;
      auVar163._2_2_ = uVar32 >> local_58;
      uVar33 = auVar148._4_2_;
      auVar163._4_2_ = uVar33 >> local_58;
      uVar34 = auVar148._6_2_;
      auVar163._6_2_ = uVar34 >> local_58;
      uVar35 = auVar148._8_2_;
      auVar163._8_2_ = uVar35 >> local_58;
      uVar36 = auVar148._10_2_;
      auVar163._10_2_ = uVar36 >> local_58;
      uVar37 = auVar148._12_2_;
      uVar38 = auVar148._14_2_;
      auVar163._12_2_ = uVar37 >> local_58;
      auVar163._14_2_ = uVar38 >> local_58;
      auVar50 = pabsw(*pauVar1,auVar181);
      uVar49 = auVar50._0_2_;
      auVar173._0_2_ = uVar49 >> local_58;
      uVar57 = auVar50._2_2_;
      auVar173._2_2_ = uVar57 >> local_58;
      uVar59 = auVar50._4_2_;
      auVar173._4_2_ = uVar59 >> local_58;
      uVar61 = auVar50._6_2_;
      auVar173._6_2_ = uVar61 >> local_58;
      uVar63 = auVar50._8_2_;
      auVar173._8_2_ = uVar63 >> local_58;
      uVar65 = auVar50._10_2_;
      auVar173._10_2_ = uVar65 >> local_58;
      uVar67 = auVar50._12_2_;
      uVar69 = auVar50._14_2_;
      auVar173._12_2_ = uVar67 >> local_58;
      auVar173._14_2_ = uVar69 >> local_58;
      auVar29 = auVar29 ^ auVar94;
      auVar50 = psubusw(auVar101,auVar163);
      auVar70 = psubusw(auVar101,auVar173);
      auVar94 = lddqu(auVar173,*(undefined1 (*) [16])((long)in + lVar19 * -2));
      sVar48 = auVar50._0_2_;
      sVar56 = auVar50._2_2_;
      sVar58 = auVar50._4_2_;
      sVar60 = auVar50._6_2_;
      sVar62 = auVar50._8_2_;
      sVar64 = auVar50._10_2_;
      sVar66 = auVar50._12_2_;
      sVar68 = auVar50._14_2_;
      auVar84 = lddqu(auVar163,*(undefined1 (*) [16])((long)in + lVar19 * -2 + 0x120));
      auVar50 = psraw(auVar73,0xf);
      auVar118 = psraw(auVar181,0xf);
      sVar141 = auVar70._0_2_;
      sVar142 = auVar70._2_2_;
      sVar143 = auVar70._4_2_;
      sVar144 = auVar70._6_2_;
      sVar145 = auVar70._8_2_;
      sVar146 = auVar70._10_2_;
      sVar147 = auVar70._12_2_;
      sVar39 = auVar70._14_2_;
      auVar154._0_2_ =
           (((short)uVar20 < sVar48) * uVar20 | (ushort)((short)uVar20 >= sVar48) * sVar48) +
           auVar50._0_2_;
      auVar154._2_2_ =
           (((short)uVar32 < sVar56) * uVar32 | (ushort)((short)uVar32 >= sVar56) * sVar56) +
           auVar50._2_2_;
      auVar154._4_2_ =
           (((short)uVar33 < sVar58) * uVar33 | (ushort)((short)uVar33 >= sVar58) * sVar58) +
           auVar50._4_2_;
      auVar154._6_2_ =
           (((short)uVar34 < sVar60) * uVar34 | (ushort)((short)uVar34 >= sVar60) * sVar60) +
           auVar50._6_2_;
      auVar154._8_2_ =
           (((short)uVar35 < sVar62) * uVar35 | (ushort)((short)uVar35 >= sVar62) * sVar62) +
           auVar50._8_2_;
      auVar154._10_2_ =
           (((short)uVar36 < sVar64) * uVar36 | (ushort)((short)uVar36 >= sVar64) * sVar64) +
           auVar50._10_2_;
      auVar154._12_2_ =
           (((short)uVar37 < sVar66) * uVar37 | (ushort)((short)uVar37 >= sVar66) * sVar66) +
           auVar50._12_2_;
      auVar154._14_2_ =
           (((short)uVar38 < sVar68) * uVar38 | (ushort)((short)uVar38 >= sVar68) * sVar68) +
           auVar50._14_2_;
      auVar132._0_2_ =
           (((short)uVar49 < sVar141) * uVar49 | (ushort)((short)uVar49 >= sVar141) * sVar141) +
           auVar118._0_2_;
      auVar132._2_2_ =
           (((short)uVar57 < sVar142) * uVar57 | (ushort)((short)uVar57 >= sVar142) * sVar142) +
           auVar118._2_2_;
      auVar132._4_2_ =
           (((short)uVar59 < sVar143) * uVar59 | (ushort)((short)uVar59 >= sVar143) * sVar143) +
           auVar118._4_2_;
      auVar132._6_2_ =
           (((short)uVar61 < sVar144) * uVar61 | (ushort)((short)uVar61 >= sVar144) * sVar144) +
           auVar118._6_2_;
      auVar132._8_2_ =
           (((short)uVar63 < sVar145) * uVar63 | (ushort)((short)uVar63 >= sVar145) * sVar145) +
           auVar118._8_2_;
      auVar132._10_2_ =
           (((short)uVar65 < sVar146) * uVar65 | (ushort)((short)uVar65 >= sVar146) * sVar146) +
           auVar118._10_2_;
      auVar132._12_2_ =
           (((short)uVar67 < sVar147) * uVar67 | (ushort)((short)uVar67 >= sVar147) * sVar147) +
           auVar118._12_2_;
      auVar132._14_2_ =
           (((short)uVar69 < sVar39) * uVar69 | (ushort)((short)uVar69 >= sVar39) * sVar39) +
           auVar118._14_2_;
      auVar154 = auVar154 ^ auVar50;
      in_XMM12._0_2_ = auVar154._0_2_ + auVar53._0_2_;
      in_XMM12._2_2_ = auVar154._2_2_ + auVar53._2_2_;
      in_XMM12._4_2_ = auVar154._4_2_ + auVar53._4_2_;
      in_XMM12._6_2_ = auVar154._6_2_ + auVar53._6_2_;
      in_XMM12._8_2_ = auVar154._8_2_ + auVar53._8_2_;
      in_XMM12._10_2_ = auVar154._10_2_ + auVar53._10_2_;
      in_XMM12._12_2_ = auVar154._12_2_ + auVar53._12_2_;
      in_XMM12._14_2_ = auVar154._14_2_ + auVar53._14_2_;
      auVar132 = auVar132 ^ auVar118;
      in_XMM11._0_2_ = auVar132._0_2_ + auVar29._0_2_;
      in_XMM11._2_2_ = auVar132._2_2_ + auVar29._2_2_;
      in_XMM11._4_2_ = auVar132._4_2_ + auVar29._4_2_;
      in_XMM11._6_2_ = auVar132._6_2_ + auVar29._6_2_;
      in_XMM11._8_2_ = auVar132._8_2_ + auVar29._8_2_;
      in_XMM11._10_2_ = auVar132._10_2_ + auVar29._10_2_;
      in_XMM11._12_2_ = auVar132._12_2_ + auVar29._12_2_;
      in_XMM11._14_2_ = auVar132._14_2_ + auVar29._14_2_;
      auVar120._0_2_ = auVar86._0_2_ - sVar40;
      auVar120._2_2_ = auVar86._2_2_ - sVar41;
      auVar120._4_2_ = auVar86._4_2_ - sVar42;
      auVar120._6_2_ = auVar86._6_2_ - sVar43;
      auVar120._8_2_ = auVar86._8_2_ - sVar44;
      auVar120._10_2_ = auVar86._10_2_ - sVar45;
      auVar120._12_2_ = auVar86._12_2_ - sVar46;
      auVar120._14_2_ = auVar86._14_2_ - sVar47;
      local_78 = auVar125._0_2_;
      sStack_76 = auVar125._2_2_;
      sStack_74 = auVar125._4_2_;
      sStack_72 = auVar125._6_2_;
      sStack_70 = auVar125._8_2_;
      sStack_6e = auVar125._10_2_;
      sStack_6c = auVar125._12_2_;
      sStack_6a = auVar125._14_2_;
      auVar30._0_2_ = local_78 - sVar100;
      auVar30._2_2_ = sStack_76 - sVar111;
      auVar30._4_2_ = sStack_74 - sVar112;
      auVar30._6_2_ = sStack_72 - sVar113;
      auVar30._8_2_ = sStack_70 - sVar114;
      auVar30._10_2_ = sStack_6e - sVar115;
      auVar30._12_2_ = sStack_6c - sVar116;
      auVar30._14_2_ = sStack_6a - sVar117;
      auVar148 = pabsw(auVar148,auVar120);
      auVar70 = psraw(auVar120,0xf);
      uVar20 = auVar148._0_2_;
      auVar54._0_2_ = uVar20 >> local_58;
      uVar32 = auVar148._2_2_;
      auVar54._2_2_ = uVar32 >> local_58;
      uVar33 = auVar148._4_2_;
      auVar54._4_2_ = uVar33 >> local_58;
      uVar34 = auVar148._6_2_;
      auVar54._6_2_ = uVar34 >> local_58;
      uVar35 = auVar148._8_2_;
      auVar54._8_2_ = uVar35 >> local_58;
      uVar36 = auVar148._10_2_;
      auVar54._10_2_ = uVar36 >> local_58;
      uVar37 = auVar148._12_2_;
      uVar38 = auVar148._14_2_;
      auVar54._12_2_ = uVar37 >> local_58;
      auVar54._14_2_ = uVar38 >> local_58;
      auVar125 = pabsw(auVar50,auVar30);
      uVar49 = auVar125._0_2_;
      auVar81._0_2_ = uVar49 >> local_58;
      uVar57 = auVar125._2_2_;
      auVar81._2_2_ = uVar57 >> local_58;
      uVar59 = auVar125._4_2_;
      auVar81._4_2_ = uVar59 >> local_58;
      uVar61 = auVar125._6_2_;
      auVar81._6_2_ = uVar61 >> local_58;
      uVar63 = auVar125._8_2_;
      auVar81._8_2_ = uVar63 >> local_58;
      uVar65 = auVar125._10_2_;
      auVar81._10_2_ = uVar65 >> local_58;
      uVar67 = auVar125._12_2_;
      uVar69 = auVar125._14_2_;
      auVar81._12_2_ = uVar67 >> local_58;
      auVar81._14_2_ = uVar69 >> local_58;
      in_XMM6 = psraw(auVar30,0xf);
      auVar125 = psubusw(auVar101,auVar54);
      auVar50 = psubusw(auVar101,auVar81);
      sVar141 = auVar125._0_2_;
      sVar142 = auVar125._2_2_;
      sVar143 = auVar125._4_2_;
      sVar144 = auVar125._6_2_;
      sVar145 = auVar125._8_2_;
      sVar146 = auVar125._10_2_;
      sVar147 = auVar125._12_2_;
      sVar39 = auVar125._14_2_;
      sVar48 = auVar50._0_2_;
      sVar56 = auVar50._2_2_;
      sVar58 = auVar50._4_2_;
      sVar60 = auVar50._6_2_;
      sVar62 = auVar50._8_2_;
      sVar64 = auVar50._10_2_;
      sVar66 = auVar50._12_2_;
      sVar68 = auVar50._14_2_;
      auVar31._0_2_ =
           (((short)uVar20 < sVar141) * uVar20 | (ushort)((short)uVar20 >= sVar141) * sVar141) +
           auVar70._0_2_;
      auVar31._2_2_ =
           (((short)uVar32 < sVar142) * uVar32 | (ushort)((short)uVar32 >= sVar142) * sVar142) +
           auVar70._2_2_;
      auVar31._4_2_ =
           (((short)uVar33 < sVar143) * uVar33 | (ushort)((short)uVar33 >= sVar143) * sVar143) +
           auVar70._4_2_;
      auVar31._6_2_ =
           (((short)uVar34 < sVar144) * uVar34 | (ushort)((short)uVar34 >= sVar144) * sVar144) +
           auVar70._6_2_;
      auVar31._8_2_ =
           (((short)uVar35 < sVar145) * uVar35 | (ushort)((short)uVar35 >= sVar145) * sVar145) +
           auVar70._8_2_;
      auVar31._10_2_ =
           (((short)uVar36 < sVar146) * uVar36 | (ushort)((short)uVar36 >= sVar146) * sVar146) +
           auVar70._10_2_;
      auVar31._12_2_ =
           (((short)uVar37 < sVar147) * uVar37 | (ushort)((short)uVar37 >= sVar147) * sVar147) +
           auVar70._12_2_;
      auVar31._14_2_ =
           (((short)uVar38 < sVar39) * uVar38 | (ushort)((short)uVar38 >= sVar39) * sVar39) +
           auVar70._14_2_;
      auVar182._0_2_ =
           (((short)uVar49 < sVar48) * uVar49 | (ushort)((short)uVar49 >= sVar48) * sVar48) +
           in_XMM6._0_2_;
      auVar182._2_2_ =
           (((short)uVar57 < sVar56) * uVar57 | (ushort)((short)uVar57 >= sVar56) * sVar56) +
           in_XMM6._2_2_;
      auVar182._4_2_ =
           (((short)uVar59 < sVar58) * uVar59 | (ushort)((short)uVar59 >= sVar58) * sVar58) +
           in_XMM6._4_2_;
      auVar182._6_2_ =
           (((short)uVar61 < sVar60) * uVar61 | (ushort)((short)uVar61 >= sVar60) * sVar60) +
           in_XMM6._6_2_;
      auVar182._8_2_ =
           (((short)uVar63 < sVar62) * uVar63 | (ushort)((short)uVar63 >= sVar62) * sVar62) +
           in_XMM6._8_2_;
      auVar182._10_2_ =
           (((short)uVar65 < sVar64) * uVar65 | (ushort)((short)uVar65 >= sVar64) * sVar64) +
           in_XMM6._10_2_;
      auVar182._12_2_ =
           (((short)uVar67 < sVar66) * uVar67 | (ushort)((short)uVar67 >= sVar66) * sVar66) +
           in_XMM6._12_2_;
      auVar182._14_2_ =
           (((short)uVar69 < sVar68) * uVar69 | (ushort)((short)uVar69 >= sVar68) * sVar68) +
           in_XMM6._14_2_;
      auVar31 = auVar31 ^ auVar70;
      auVar174._0_2_ = auVar94._0_2_ - sVar40;
      auVar174._2_2_ = auVar94._2_2_ - sVar41;
      auVar174._4_2_ = auVar94._4_2_ - sVar42;
      auVar174._6_2_ = auVar94._6_2_ - sVar43;
      auVar174._8_2_ = auVar94._8_2_ - sVar44;
      auVar174._10_2_ = auVar94._10_2_ - sVar45;
      auVar174._12_2_ = auVar94._12_2_ - sVar46;
      auVar174._14_2_ = auVar94._14_2_ - sVar47;
      auVar164._0_2_ = auVar84._0_2_ - sVar100;
      auVar164._2_2_ = auVar84._2_2_ - sVar111;
      auVar164._4_2_ = auVar84._4_2_ - sVar112;
      auVar164._6_2_ = auVar84._6_2_ - sVar113;
      auVar164._8_2_ = auVar84._8_2_ - sVar114;
      auVar164._10_2_ = auVar84._10_2_ - sVar115;
      auVar164._12_2_ = auVar84._12_2_ - sVar116;
      auVar164._14_2_ = auVar84._14_2_ - sVar117;
      auVar125 = pabsw(auVar148,auVar174);
      uVar20 = auVar125._0_2_;
      auVar55._0_2_ = uVar20 >> local_58;
      uVar32 = auVar125._2_2_;
      auVar55._2_2_ = uVar32 >> local_58;
      uVar33 = auVar125._4_2_;
      auVar55._4_2_ = uVar33 >> local_58;
      uVar34 = auVar125._6_2_;
      auVar55._6_2_ = uVar34 >> local_58;
      uVar35 = auVar125._8_2_;
      auVar55._8_2_ = uVar35 >> local_58;
      uVar36 = auVar125._10_2_;
      auVar55._10_2_ = uVar36 >> local_58;
      uVar37 = auVar125._12_2_;
      uVar38 = auVar125._14_2_;
      auVar55._12_2_ = uVar37 >> local_58;
      auVar55._14_2_ = uVar38 >> local_58;
      auVar125 = pabsw(auVar81,auVar164);
      uVar49 = auVar125._0_2_;
      in_XMM10._0_2_ = uVar49 >> local_58;
      uVar57 = auVar125._2_2_;
      in_XMM10._2_2_ = uVar57 >> local_58;
      uVar59 = auVar125._4_2_;
      in_XMM10._4_2_ = uVar59 >> local_58;
      uVar61 = auVar125._6_2_;
      in_XMM10._6_2_ = uVar61 >> local_58;
      uVar63 = auVar125._8_2_;
      in_XMM10._8_2_ = uVar63 >> local_58;
      uVar65 = auVar125._10_2_;
      in_XMM10._10_2_ = uVar65 >> local_58;
      uVar67 = auVar125._12_2_;
      uVar69 = auVar125._14_2_;
      in_XMM10._12_2_ = uVar67 >> local_58;
      in_XMM10._14_2_ = uVar69 >> local_58;
      auVar182 = auVar182 ^ in_XMM6;
      auVar125 = psubusw(auVar101,auVar55);
      auVar101 = psubusw(auVar101,in_XMM10);
      sVar141 = auVar125._0_2_;
      sVar142 = auVar125._2_2_;
      sVar143 = auVar125._4_2_;
      sVar144 = auVar125._6_2_;
      sVar145 = auVar125._8_2_;
      sVar146 = auVar125._10_2_;
      sVar147 = auVar125._12_2_;
      sVar39 = auVar125._14_2_;
      sVar48 = auVar101._0_2_;
      sVar56 = auVar101._2_2_;
      sVar58 = auVar101._4_2_;
      sVar60 = auVar101._6_2_;
      sVar62 = auVar101._8_2_;
      sVar64 = auVar101._10_2_;
      sVar66 = auVar101._12_2_;
      sVar68 = auVar101._14_2_;
      in_XMM14 = psraw(auVar174,0xf);
      auVar74._0_2_ =
           (((short)uVar20 < sVar141) * uVar20 | (ushort)((short)uVar20 >= sVar141) * sVar141) +
           in_XMM14._0_2_;
      auVar74._2_2_ =
           (((short)uVar32 < sVar142) * uVar32 | (ushort)((short)uVar32 >= sVar142) * sVar142) +
           in_XMM14._2_2_;
      auVar74._4_2_ =
           (((short)uVar33 < sVar143) * uVar33 | (ushort)((short)uVar33 >= sVar143) * sVar143) +
           in_XMM14._4_2_;
      auVar74._6_2_ =
           (((short)uVar34 < sVar144) * uVar34 | (ushort)((short)uVar34 >= sVar144) * sVar144) +
           in_XMM14._6_2_;
      auVar74._8_2_ =
           (((short)uVar35 < sVar145) * uVar35 | (ushort)((short)uVar35 >= sVar145) * sVar145) +
           in_XMM14._8_2_;
      auVar74._10_2_ =
           (((short)uVar36 < sVar146) * uVar36 | (ushort)((short)uVar36 >= sVar146) * sVar146) +
           in_XMM14._10_2_;
      auVar74._12_2_ =
           (((short)uVar37 < sVar147) * uVar37 | (ushort)((short)uVar37 >= sVar147) * sVar147) +
           in_XMM14._12_2_;
      auVar74._14_2_ =
           (((short)uVar38 < sVar39) * uVar38 | (ushort)((short)uVar38 >= sVar39) * sVar39) +
           in_XMM14._14_2_;
      auVar74 = auVar74 ^ in_XMM14;
      in_XMM13 = psraw(auVar164,0xf);
      auVar102._0_2_ =
           (((short)uVar49 < sVar48) * uVar49 | (ushort)((short)uVar49 >= sVar48) * sVar48) +
           in_XMM13._0_2_;
      auVar102._2_2_ =
           (((short)uVar57 < sVar56) * uVar57 | (ushort)((short)uVar57 >= sVar56) * sVar56) +
           in_XMM13._2_2_;
      auVar102._4_2_ =
           (((short)uVar59 < sVar58) * uVar59 | (ushort)((short)uVar59 >= sVar58) * sVar58) +
           in_XMM13._4_2_;
      auVar102._6_2_ =
           (((short)uVar61 < sVar60) * uVar61 | (ushort)((short)uVar61 >= sVar60) * sVar60) +
           in_XMM13._6_2_;
      auVar102._8_2_ =
           (((short)uVar63 < sVar62) * uVar63 | (ushort)((short)uVar63 >= sVar62) * sVar62) +
           in_XMM13._8_2_;
      auVar102._10_2_ =
           (((short)uVar65 < sVar64) * uVar65 | (ushort)((short)uVar65 >= sVar64) * sVar64) +
           in_XMM13._10_2_;
      auVar102._12_2_ =
           (((short)uVar67 < sVar66) * uVar67 | (ushort)((short)uVar67 >= sVar66) * sVar66) +
           in_XMM13._12_2_;
      auVar102._14_2_ =
           (((short)uVar69 < sVar68) * uVar69 | (ushort)((short)uVar69 >= sVar68) * sVar68) +
           in_XMM13._14_2_;
      auVar102 = auVar102 ^ in_XMM13;
      in_XMM8._0_2_ = (auVar96._0_2_ + auVar52._0_2_ + auVar152._0_2_) * local_88;
      in_XMM8._2_2_ = (auVar96._2_2_ + auVar52._2_2_ + auVar152._2_2_) * sStack_86;
      in_XMM8._4_2_ = (auVar96._4_2_ + auVar52._4_2_ + auVar152._4_2_) * local_88;
      in_XMM8._6_2_ = (auVar96._6_2_ + auVar52._6_2_ + auVar152._6_2_) * sStack_86;
      in_XMM8._8_2_ = (auVar96._8_2_ + auVar52._8_2_ + auVar152._8_2_) * local_88;
      in_XMM8._10_2_ = (auVar96._10_2_ + auVar52._10_2_ + auVar152._10_2_) * sStack_86;
      in_XMM8._12_2_ = (auVar96._12_2_ + auVar52._12_2_ + auVar152._12_2_) * local_88;
      in_XMM8._14_2_ = (auVar96._14_2_ + auVar52._14_2_ + auVar152._14_2_) * sStack_86;
      auVar125._4_4_ = uVar22;
      auVar125._0_4_ = uVar22;
      auVar125._8_4_ = uVar22;
      auVar125._12_4_ = uVar22;
      sVar141 = auVar23._0_2_;
      sVar142 = auVar23._2_2_;
      auVar75._0_2_ = (auVar74._0_2_ + auVar31._0_2_ + in_XMM12._0_2_) * sVar141 + in_XMM8._0_2_;
      auVar75._2_2_ = (auVar74._2_2_ + auVar31._2_2_ + in_XMM12._2_2_) * sVar142 + in_XMM8._2_2_;
      auVar75._4_2_ = (auVar74._4_2_ + auVar31._4_2_ + in_XMM12._4_2_) * sVar141 + in_XMM8._4_2_;
      auVar75._6_2_ = (auVar74._6_2_ + auVar31._6_2_ + in_XMM12._6_2_) * sVar142 + in_XMM8._6_2_;
      auVar75._8_2_ = (auVar74._8_2_ + auVar31._8_2_ + in_XMM12._8_2_) * sVar141 + in_XMM8._8_2_;
      auVar75._10_2_ =
           (auVar74._10_2_ + auVar31._10_2_ + in_XMM12._10_2_) * sVar142 + in_XMM8._10_2_;
      auVar75._12_2_ =
           (auVar74._12_2_ + auVar31._12_2_ + in_XMM12._12_2_) * sVar141 + in_XMM8._12_2_;
      auVar75._14_2_ =
           (auVar74._14_2_ + auVar31._14_2_ + in_XMM12._14_2_) * sVar142 + in_XMM8._14_2_;
      in_XMM7._0_2_ = (auVar88._0_2_ + auVar27._0_2_ + auVar130._0_2_) * local_88;
      in_XMM7._2_2_ = (auVar88._2_2_ + auVar27._2_2_ + auVar130._2_2_) * sStack_86;
      in_XMM7._4_2_ = (auVar88._4_2_ + auVar27._4_2_ + auVar130._4_2_) * local_88;
      in_XMM7._6_2_ = (auVar88._6_2_ + auVar27._6_2_ + auVar130._6_2_) * sStack_86;
      in_XMM7._8_2_ = (auVar88._8_2_ + auVar27._8_2_ + auVar130._8_2_) * local_88;
      in_XMM7._10_2_ = (auVar88._10_2_ + auVar27._10_2_ + auVar130._10_2_) * sStack_86;
      in_XMM7._12_2_ = (auVar88._12_2_ + auVar27._12_2_ + auVar130._12_2_) * local_88;
      in_XMM7._14_2_ = (auVar88._14_2_ + auVar27._14_2_ + auVar130._14_2_) * sStack_86;
      auVar103._0_2_ = (auVar102._0_2_ + auVar182._0_2_ + in_XMM11._0_2_) * sVar141 + in_XMM7._0_2_;
      auVar103._2_2_ = (auVar102._2_2_ + auVar182._2_2_ + in_XMM11._2_2_) * sVar142 + in_XMM7._2_2_;
      auVar103._4_2_ = (auVar102._4_2_ + auVar182._4_2_ + in_XMM11._4_2_) * sVar141 + in_XMM7._4_2_;
      auVar103._6_2_ = (auVar102._6_2_ + auVar182._6_2_ + in_XMM11._6_2_) * sVar142 + in_XMM7._6_2_;
      auVar103._8_2_ = (auVar102._8_2_ + auVar182._8_2_ + in_XMM11._8_2_) * sVar141 + in_XMM7._8_2_;
      auVar103._10_2_ =
           (auVar102._10_2_ + auVar182._10_2_ + in_XMM11._10_2_) * sVar142 + in_XMM7._10_2_;
      auVar103._12_2_ =
           (auVar102._12_2_ + auVar182._12_2_ + in_XMM11._12_2_) * sVar141 + in_XMM7._12_2_;
      auVar103._14_2_ =
           (auVar102._14_2_ + auVar182._14_2_ + in_XMM11._14_2_) * sVar142 + in_XMM7._14_2_;
      auVar101 = psraw(auVar75,0xf);
      auVar125 = pmovsxbw(auVar125,0x808080808080808);
      auVar76._0_2_ = auVar75._0_2_ + auVar125._0_2_ + auVar101._0_2_;
      auVar76._2_2_ = auVar75._2_2_ + auVar125._2_2_ + auVar101._2_2_;
      auVar76._4_2_ = auVar75._4_2_ + auVar125._4_2_ + auVar101._4_2_;
      auVar76._6_2_ = auVar75._6_2_ + auVar125._6_2_ + auVar101._6_2_;
      auVar76._8_2_ = auVar75._8_2_ + auVar125._8_2_ + auVar101._8_2_;
      auVar76._10_2_ = auVar75._10_2_ + auVar125._10_2_ + auVar101._10_2_;
      auVar76._12_2_ = auVar75._12_2_ + auVar125._12_2_ + auVar101._12_2_;
      auVar76._14_2_ = auVar75._14_2_ + auVar125._14_2_ + auVar101._14_2_;
      auVar101 = psraw(auVar103,0xf);
      auVar104._0_2_ = auVar103._0_2_ + auVar125._0_2_ + auVar101._0_2_;
      auVar104._2_2_ = auVar103._2_2_ + auVar125._2_2_ + auVar101._2_2_;
      auVar104._4_2_ = auVar103._4_2_ + auVar125._4_2_ + auVar101._4_2_;
      auVar104._6_2_ = auVar103._6_2_ + auVar125._6_2_ + auVar101._6_2_;
      auVar104._8_2_ = auVar103._8_2_ + auVar125._8_2_ + auVar101._8_2_;
      auVar104._10_2_ = auVar103._10_2_ + auVar125._10_2_ + auVar101._10_2_;
      auVar104._12_2_ = auVar103._12_2_ + auVar125._12_2_ + auVar101._12_2_;
      auVar104._14_2_ = auVar103._14_2_ + auVar125._14_2_ + auVar101._14_2_;
      auVar101 = psraw(auVar76,4);
      in_XMM4._0_2_ = auVar101._0_2_ + sVar40;
      in_XMM4._2_2_ = auVar101._2_2_ + sVar41;
      in_XMM4._4_2_ = auVar101._4_2_ + sVar42;
      in_XMM4._6_2_ = auVar101._6_2_ + sVar43;
      in_XMM4._8_2_ = auVar101._8_2_ + sVar44;
      in_XMM4._10_2_ = auVar101._10_2_ + sVar45;
      in_XMM4._12_2_ = auVar101._12_2_ + sVar46;
      in_XMM4._14_2_ = auVar101._14_2_ + sVar47;
      auVar101 = psraw(auVar104,4);
      sVar100 = auVar101._0_2_ + sVar100;
      sVar111 = auVar101._2_2_ + sVar111;
      sVar112 = auVar101._4_2_ + sVar112;
      sVar113 = auVar101._6_2_ + sVar113;
      sVar114 = auVar101._8_2_ + sVar114;
      sVar115 = auVar101._10_2_ + sVar115;
      sVar116 = auVar101._12_2_ + sVar116;
      sVar117 = auVar101._14_2_ + sVar117;
      *(char *)((long)dest + 8) =
           (0 < in_XMM4._0_2_) * (in_XMM4._0_2_ < 0x100) * (char)in_XMM4._0_2_ -
           (0xff < in_XMM4._0_2_);
      *(char *)((long)dest + 9) =
           (0 < in_XMM4._2_2_) * (in_XMM4._2_2_ < 0x100) * (char)in_XMM4._2_2_ -
           (0xff < in_XMM4._2_2_);
      *(char *)((long)dest + 10) =
           (0 < in_XMM4._4_2_) * (in_XMM4._4_2_ < 0x100) * (char)in_XMM4._4_2_ -
           (0xff < in_XMM4._4_2_);
      *(char *)((long)dest + 0xb) =
           (0 < in_XMM4._6_2_) * (in_XMM4._6_2_ < 0x100) * (char)in_XMM4._6_2_ -
           (0xff < in_XMM4._6_2_);
      *(char *)((long)dest + 0xc) =
           (0 < in_XMM4._8_2_) * (in_XMM4._8_2_ < 0x100) * (char)in_XMM4._8_2_ -
           (0xff < in_XMM4._8_2_);
      *(char *)((long)dest + 0xd) =
           (0 < in_XMM4._10_2_) * (in_XMM4._10_2_ < 0x100) * (char)in_XMM4._10_2_ -
           (0xff < in_XMM4._10_2_);
      *(char *)((long)dest + 0xe) =
           (0 < in_XMM4._12_2_) * (in_XMM4._12_2_ < 0x100) * (char)in_XMM4._12_2_ -
           (0xff < in_XMM4._12_2_);
      *(char *)((long)dest + 0xf) =
           (0 < in_XMM4._14_2_) * (in_XMM4._14_2_ < 0x100) * (char)in_XMM4._14_2_ -
           (0xff < in_XMM4._14_2_);
      pcVar2 = (char *)((long)dest + (long)dstride);
      *pcVar2 = (0 < sVar100) * (sVar100 < 0x100) * (char)sVar100 - (0xff < sVar100);
      pcVar2[1] = (0 < sVar111) * (sVar111 < 0x100) * (char)sVar111 - (0xff < sVar111);
      pcVar2[2] = (0 < sVar112) * (sVar112 < 0x100) * (char)sVar112 - (0xff < sVar112);
      pcVar2[3] = (0 < sVar113) * (sVar113 < 0x100) * (char)sVar113 - (0xff < sVar113);
      pcVar2[4] = (0 < sVar114) * (sVar114 < 0x100) * (char)sVar114 - (0xff < sVar114);
      pcVar2[5] = (0 < sVar115) * (sVar115 < 0x100) * (char)sVar115 - (0xff < sVar115);
      pcVar2[6] = (0 < sVar116) * (sVar116 < 0x100) * (char)sVar116 - (0xff < sVar116);
      pcVar2[7] = (0 < sVar117) * (sVar117 < 0x100) * (char)sVar117 - (0xff < sVar117);
      dest = (void *)((long)dest + (long)dstride * 2);
      in = (uint16_t *)((long)in + 0x240);
    }
  }
  else {
    uVar15 = sec_damping;
    if (sec_strength != 0) {
      iVar11 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar11 == 0; iVar11 = iVar11 + -1) {
        }
      }
      uVar15 = sec_damping - iVar11;
      if (sec_damping < iVar11) {
        uVar15 = 0;
      }
    }
    auVar23 = pshuflw(ZEXT416((uint)sec_strength),ZEXT416((uint)sec_strength),0);
    auVar23._4_4_ = auVar23._0_4_;
    auVar23._8_4_ = auVar23._0_4_;
    auVar23._12_4_ = auVar23._0_4_;
    auVar101 = pshuflw(ZEXT416((uint)2),ZEXT416((uint)2),0);
    auVar125 = pshuflw(ZEXT416((uint)1),ZEXT416((uint)1),0);
    sStack_84 = auVar125._0_2_;
    sStack_82 = auVar125._2_2_;
    lVar16 = (long)dstride;
    for (lVar18 = 0; lVar18 < block_height; lVar18 = lVar18 + 4) {
      uVar3 = *(undefined8 *)in;
      uVar4 = *(undefined8 *)(in + 0x90);
      auVar50._8_8_ = uVar3;
      auVar50._0_8_ = uVar4;
      uVar5 = *(undefined8 *)(in + 0x120);
      uVar6 = *(undefined8 *)(in + 0x1b0);
      uVar7 = *(undefined8 *)(in + lVar13);
      uVar8 = *(undefined8 *)(in + lVar13 + 0x90);
      uVar9 = *(undefined8 *)(in + lVar13 + 0x120);
      uVar10 = *(undefined8 *)(in + lVar13 + 0x1b0);
      sVar39 = (short)uVar4;
      auVar127._0_2_ = (short)uVar8 - sVar39;
      sVar40 = (short)((ulong)uVar4 >> 0x10);
      auVar127._2_2_ = (short)((ulong)uVar8 >> 0x10) - sVar40;
      sVar41 = (short)((ulong)uVar4 >> 0x20);
      auVar127._4_2_ = (short)((ulong)uVar8 >> 0x20) - sVar41;
      sVar42 = (short)((ulong)uVar4 >> 0x30);
      auVar127._6_2_ = (short)((ulong)uVar8 >> 0x30) - sVar42;
      sVar43 = (short)uVar3;
      auVar127._8_2_ = (short)uVar7 - sVar43;
      sVar44 = (short)((ulong)uVar3 >> 0x10);
      auVar127._10_2_ = (short)((ulong)uVar7 >> 0x10) - sVar44;
      sVar45 = (short)((ulong)uVar3 >> 0x20);
      auVar127._12_2_ = (short)((ulong)uVar7 >> 0x20) - sVar45;
      sVar46 = (short)((ulong)uVar3 >> 0x30);
      auVar127._14_2_ = (short)((ulong)uVar7 >> 0x30) - sVar46;
      sVar117 = (short)uVar6;
      auVar105._0_2_ = (short)uVar10 - sVar117;
      sVar141 = (short)((ulong)uVar6 >> 0x10);
      auVar105._2_2_ = (short)((ulong)uVar10 >> 0x10) - sVar141;
      sVar142 = (short)((ulong)uVar6 >> 0x20);
      auVar105._4_2_ = (short)((ulong)uVar10 >> 0x20) - sVar142;
      sVar143 = (short)((ulong)uVar6 >> 0x30);
      auVar105._6_2_ = (short)((ulong)uVar10 >> 0x30) - sVar143;
      sVar144 = (short)uVar5;
      auVar105._8_2_ = (short)uVar9 - sVar144;
      sVar145 = (short)((ulong)uVar5 >> 0x10);
      auVar105._10_2_ = (short)((ulong)uVar9 >> 0x10) - sVar145;
      sVar146 = (short)((ulong)uVar5 >> 0x20);
      auVar105._12_2_ = (short)((ulong)uVar9 >> 0x20) - sVar146;
      sVar147 = (short)((ulong)uVar5 >> 0x30);
      auVar105._14_2_ = (short)((ulong)uVar9 >> 0x30) - sVar147;
      auVar70 = pabsw(in_XMM10,auVar127);
      auVar148 = psraw(auVar127,0xf);
      auVar84 = pabsw(in_XMM11,auVar105);
      auVar86 = psraw(auVar105,0xf);
      uVar82 = (ulong)uVar15;
      uVar20 = auVar70._0_2_;
      auVar89._0_2_ = uVar20 >> uVar82;
      uVar32 = auVar70._2_2_;
      auVar89._2_2_ = uVar32 >> uVar82;
      uVar33 = auVar70._4_2_;
      auVar89._4_2_ = uVar33 >> uVar82;
      uVar34 = auVar70._6_2_;
      auVar89._6_2_ = uVar34 >> uVar82;
      uVar35 = auVar70._8_2_;
      auVar89._8_2_ = uVar35 >> uVar82;
      uVar36 = auVar70._10_2_;
      auVar89._10_2_ = uVar36 >> uVar82;
      uVar37 = auVar70._12_2_;
      uVar38 = auVar70._14_2_;
      auVar89._12_2_ = uVar37 >> uVar82;
      auVar89._14_2_ = uVar38 >> uVar82;
      uVar49 = auVar84._0_2_;
      auVar155._0_2_ = uVar49 >> uVar82;
      uVar57 = auVar84._2_2_;
      auVar155._2_2_ = uVar57 >> uVar82;
      uVar59 = auVar84._4_2_;
      auVar155._4_2_ = uVar59 >> uVar82;
      uVar61 = auVar84._6_2_;
      auVar155._6_2_ = uVar61 >> uVar82;
      uVar63 = auVar84._8_2_;
      auVar155._8_2_ = uVar63 >> uVar82;
      uVar65 = auVar84._10_2_;
      auVar155._10_2_ = uVar65 >> uVar82;
      uVar67 = auVar84._12_2_;
      uVar69 = auVar84._14_2_;
      auVar155._12_2_ = uVar67 >> uVar82;
      auVar155._14_2_ = uVar69 >> uVar82;
      auVar84 = psubusw(auVar23,auVar89);
      auVar70 = psubusw(auVar23,auVar155);
      sVar68 = auVar84._0_2_;
      sVar100 = auVar84._2_2_;
      sVar111 = auVar84._4_2_;
      sVar112 = auVar84._6_2_;
      sVar113 = auVar84._8_2_;
      sVar114 = auVar84._10_2_;
      sVar115 = auVar84._12_2_;
      sVar116 = auVar84._14_2_;
      sVar47 = auVar70._0_2_;
      sVar48 = auVar70._2_2_;
      sVar56 = auVar70._4_2_;
      sVar58 = auVar70._6_2_;
      sVar60 = auVar70._8_2_;
      sVar62 = auVar70._10_2_;
      sVar64 = auVar70._12_2_;
      sVar66 = auVar70._14_2_;
      auVar97._0_2_ =
           (((short)uVar20 < sVar68) * uVar20 | (ushort)((short)uVar20 >= sVar68) * sVar68) +
           auVar148._0_2_;
      auVar97._2_2_ =
           (((short)uVar32 < sVar100) * uVar32 | (ushort)((short)uVar32 >= sVar100) * sVar100) +
           auVar148._2_2_;
      auVar97._4_2_ =
           (((short)uVar33 < sVar111) * uVar33 | (ushort)((short)uVar33 >= sVar111) * sVar111) +
           auVar148._4_2_;
      auVar97._6_2_ =
           (((short)uVar34 < sVar112) * uVar34 | (ushort)((short)uVar34 >= sVar112) * sVar112) +
           auVar148._6_2_;
      auVar97._8_2_ =
           (((short)uVar35 < sVar113) * uVar35 | (ushort)((short)uVar35 >= sVar113) * sVar113) +
           auVar148._8_2_;
      auVar97._10_2_ =
           (((short)uVar36 < sVar114) * uVar36 | (ushort)((short)uVar36 >= sVar114) * sVar114) +
           auVar148._10_2_;
      auVar97._12_2_ =
           (((short)uVar37 < sVar115) * uVar37 | (ushort)((short)uVar37 >= sVar115) * sVar115) +
           auVar148._12_2_;
      auVar97._14_2_ =
           (((short)uVar38 < sVar116) * uVar38 | (ushort)((short)uVar38 >= sVar116) * sVar116) +
           auVar148._14_2_;
      auVar90._0_2_ =
           (((short)uVar49 < sVar47) * uVar49 | (ushort)((short)uVar49 >= sVar47) * sVar47) +
           auVar86._0_2_;
      auVar90._2_2_ =
           (((short)uVar57 < sVar48) * uVar57 | (ushort)((short)uVar57 >= sVar48) * sVar48) +
           auVar86._2_2_;
      auVar90._4_2_ =
           (((short)uVar59 < sVar56) * uVar59 | (ushort)((short)uVar59 >= sVar56) * sVar56) +
           auVar86._4_2_;
      auVar90._6_2_ =
           (((short)uVar61 < sVar58) * uVar61 | (ushort)((short)uVar61 >= sVar58) * sVar58) +
           auVar86._6_2_;
      auVar90._8_2_ =
           (((short)uVar63 < sVar60) * uVar63 | (ushort)((short)uVar63 >= sVar60) * sVar60) +
           auVar86._8_2_;
      auVar90._10_2_ =
           (((short)uVar65 < sVar62) * uVar65 | (ushort)((short)uVar65 >= sVar62) * sVar62) +
           auVar86._10_2_;
      auVar90._12_2_ =
           (((short)uVar67 < sVar64) * uVar67 | (ushort)((short)uVar67 >= sVar64) * sVar64) +
           auVar86._12_2_;
      auVar90._14_2_ =
           (((short)uVar69 < sVar66) * uVar69 | (ushort)((short)uVar69 >= sVar66) * sVar66) +
           auVar86._14_2_;
      auVar97 = auVar97 ^ auVar148;
      auVar90 = auVar90 ^ auVar86;
      uVar3 = *(undefined8 *)(in + -lVar13);
      uVar4 = *(undefined8 *)(in + (0x90 - lVar13));
      uVar5 = *(undefined8 *)(in + (0x120 - lVar13));
      uVar6 = *(undefined8 *)(in + (0x1b0 - lVar13));
      auVar150._0_2_ = (short)uVar4 - sVar39;
      auVar150._2_2_ = (short)((ulong)uVar4 >> 0x10) - sVar40;
      auVar150._4_2_ = (short)((ulong)uVar4 >> 0x20) - sVar41;
      auVar150._6_2_ = (short)((ulong)uVar4 >> 0x30) - sVar42;
      auVar150._8_2_ = (short)uVar3 - sVar43;
      auVar150._10_2_ = (short)((ulong)uVar3 >> 0x10) - sVar44;
      auVar150._12_2_ = (short)((ulong)uVar3 >> 0x20) - sVar45;
      auVar150._14_2_ = (short)((ulong)uVar3 >> 0x30) - sVar46;
      auVar133._0_2_ = (short)uVar6 - sVar117;
      auVar133._2_2_ = (short)((ulong)uVar6 >> 0x10) - sVar141;
      auVar133._4_2_ = (short)((ulong)uVar6 >> 0x20) - sVar142;
      auVar133._6_2_ = (short)((ulong)uVar6 >> 0x30) - sVar143;
      auVar133._8_2_ = (short)uVar5 - sVar144;
      auVar133._10_2_ = (short)((ulong)uVar5 >> 0x10) - sVar145;
      auVar133._12_2_ = (short)((ulong)uVar5 >> 0x20) - sVar146;
      auVar133._14_2_ = (short)((ulong)uVar5 >> 0x30) - sVar147;
      auVar70 = pabsw(auVar155,auVar150);
      auVar148 = psraw(auVar150,0xf);
      auVar94 = pabsw(in_XMM13,auVar133);
      auVar86 = psraw(auVar133,0xf);
      uVar83 = (ulong)uVar15;
      uVar20 = auVar70._0_2_;
      auVar106._0_2_ = uVar20 >> uVar83;
      uVar32 = auVar70._2_2_;
      auVar106._2_2_ = uVar32 >> uVar83;
      uVar33 = auVar70._4_2_;
      auVar106._4_2_ = uVar33 >> uVar83;
      uVar34 = auVar70._6_2_;
      auVar106._6_2_ = uVar34 >> uVar83;
      uVar35 = auVar70._8_2_;
      auVar106._8_2_ = uVar35 >> uVar83;
      uVar36 = auVar70._10_2_;
      auVar106._10_2_ = uVar36 >> uVar83;
      uVar37 = auVar70._12_2_;
      uVar38 = auVar70._14_2_;
      auVar106._12_2_ = uVar37 >> uVar83;
      auVar106._14_2_ = uVar38 >> uVar83;
      uVar49 = auVar94._0_2_;
      auVar175._0_2_ = uVar49 >> uVar83;
      uVar57 = auVar94._2_2_;
      auVar175._2_2_ = uVar57 >> uVar83;
      uVar59 = auVar94._4_2_;
      auVar175._4_2_ = uVar59 >> uVar83;
      uVar61 = auVar94._6_2_;
      auVar175._6_2_ = uVar61 >> uVar83;
      uVar63 = auVar94._8_2_;
      auVar175._8_2_ = uVar63 >> uVar83;
      uVar65 = auVar94._10_2_;
      auVar175._10_2_ = uVar65 >> uVar83;
      uVar67 = auVar94._12_2_;
      uVar69 = auVar94._14_2_;
      auVar175._12_2_ = uVar67 >> uVar83;
      auVar175._14_2_ = uVar69 >> uVar83;
      auVar84 = psubusw(auVar23,auVar106);
      auVar70 = psubusw(auVar23,auVar175);
      sVar68 = auVar84._0_2_;
      sVar100 = auVar84._2_2_;
      sVar111 = auVar84._4_2_;
      sVar112 = auVar84._6_2_;
      sVar113 = auVar84._8_2_;
      sVar114 = auVar84._10_2_;
      sVar115 = auVar84._12_2_;
      sVar116 = auVar84._14_2_;
      sVar47 = auVar70._0_2_;
      sVar48 = auVar70._2_2_;
      sVar56 = auVar70._4_2_;
      sVar58 = auVar70._6_2_;
      sVar60 = auVar70._8_2_;
      sVar62 = auVar70._10_2_;
      sVar64 = auVar70._12_2_;
      sVar66 = auVar70._14_2_;
      auVar121._0_2_ =
           (((short)uVar20 < sVar68) * uVar20 | (ushort)((short)uVar20 >= sVar68) * sVar68) +
           auVar148._0_2_;
      auVar121._2_2_ =
           (((short)uVar32 < sVar100) * uVar32 | (ushort)((short)uVar32 >= sVar100) * sVar100) +
           auVar148._2_2_;
      auVar121._4_2_ =
           (((short)uVar33 < sVar111) * uVar33 | (ushort)((short)uVar33 >= sVar111) * sVar111) +
           auVar148._4_2_;
      auVar121._6_2_ =
           (((short)uVar34 < sVar112) * uVar34 | (ushort)((short)uVar34 >= sVar112) * sVar112) +
           auVar148._6_2_;
      auVar121._8_2_ =
           (((short)uVar35 < sVar113) * uVar35 | (ushort)((short)uVar35 >= sVar113) * sVar113) +
           auVar148._8_2_;
      auVar121._10_2_ =
           (((short)uVar36 < sVar114) * uVar36 | (ushort)((short)uVar36 >= sVar114) * sVar114) +
           auVar148._10_2_;
      auVar121._12_2_ =
           (((short)uVar37 < sVar115) * uVar37 | (ushort)((short)uVar37 >= sVar115) * sVar115) +
           auVar148._12_2_;
      auVar121._14_2_ =
           (((short)uVar38 < sVar116) * uVar38 | (ushort)((short)uVar38 >= sVar116) * sVar116) +
           auVar148._14_2_;
      auVar107._0_2_ =
           (((short)uVar49 < sVar47) * uVar49 | (ushort)((short)uVar49 >= sVar47) * sVar47) +
           auVar86._0_2_;
      auVar107._2_2_ =
           (((short)uVar57 < sVar48) * uVar57 | (ushort)((short)uVar57 >= sVar48) * sVar48) +
           auVar86._2_2_;
      auVar107._4_2_ =
           (((short)uVar59 < sVar56) * uVar59 | (ushort)((short)uVar59 >= sVar56) * sVar56) +
           auVar86._4_2_;
      auVar107._6_2_ =
           (((short)uVar61 < sVar58) * uVar61 | (ushort)((short)uVar61 >= sVar58) * sVar58) +
           auVar86._6_2_;
      auVar107._8_2_ =
           (((short)uVar63 < sVar60) * uVar63 | (ushort)((short)uVar63 >= sVar60) * sVar60) +
           auVar86._8_2_;
      auVar107._10_2_ =
           (((short)uVar65 < sVar62) * uVar65 | (ushort)((short)uVar65 >= sVar62) * sVar62) +
           auVar86._10_2_;
      auVar107._12_2_ =
           (((short)uVar67 < sVar64) * uVar67 | (ushort)((short)uVar67 >= sVar64) * sVar64) +
           auVar86._12_2_;
      auVar107._14_2_ =
           (((short)uVar69 < sVar66) * uVar69 | (ushort)((short)uVar69 >= sVar66) * sVar66) +
           auVar86._14_2_;
      auVar121 = auVar121 ^ auVar148;
      auVar107 = auVar107 ^ auVar86;
      uVar3 = *(undefined8 *)(in + lVar17);
      uVar4 = *(undefined8 *)(in + lVar17 + 0x90);
      uVar82 = *(ulong *)(in + lVar17 + 0x120);
      auVar98._8_8_ = 0;
      auVar98._0_8_ = uVar82;
      uVar5 = *(undefined8 *)(in + lVar17 + 0x1b0);
      auVar160._0_2_ = (short)uVar4 - sVar39;
      auVar160._2_2_ = (short)((ulong)uVar4 >> 0x10) - sVar40;
      auVar160._4_2_ = (short)((ulong)uVar4 >> 0x20) - sVar41;
      auVar160._6_2_ = (short)((ulong)uVar4 >> 0x30) - sVar42;
      auVar160._8_2_ = (short)uVar3 - sVar43;
      auVar160._10_2_ = (short)((ulong)uVar3 >> 0x10) - sVar44;
      auVar160._12_2_ = (short)((ulong)uVar3 >> 0x20) - sVar45;
      auVar160._14_2_ = (short)((ulong)uVar3 >> 0x30) - sVar46;
      auVar91._0_2_ = (short)uVar5 - sVar117;
      auVar91._2_2_ = (short)((ulong)uVar5 >> 0x10) - sVar141;
      auVar91._4_2_ = (short)((ulong)uVar5 >> 0x20) - sVar142;
      auVar91._6_2_ = (short)((ulong)uVar5 >> 0x30) - sVar143;
      auVar91._8_2_ = (short)uVar82 - sVar144;
      auVar91._10_2_ = (short)(uVar82 >> 0x10) - sVar145;
      auVar91._12_2_ = (short)(uVar82 >> 0x20) - sVar146;
      auVar91._14_2_ = (short)(uVar82 >> 0x30) - sVar147;
      auVar70 = pabsw(auVar98,auVar160);
      auVar148 = psraw(auVar160,0xf);
      uVar20 = auVar70._0_2_;
      auVar134._0_2_ = uVar20 >> uVar83;
      uVar32 = auVar70._2_2_;
      auVar134._2_2_ = uVar32 >> uVar83;
      uVar33 = auVar70._4_2_;
      auVar134._4_2_ = uVar33 >> uVar83;
      uVar34 = auVar70._6_2_;
      auVar134._6_2_ = uVar34 >> uVar83;
      uVar35 = auVar70._8_2_;
      auVar134._8_2_ = uVar35 >> uVar83;
      uVar36 = auVar70._10_2_;
      auVar134._10_2_ = uVar36 >> uVar83;
      uVar37 = auVar70._12_2_;
      uVar38 = auVar70._14_2_;
      auVar134._12_2_ = uVar37 >> uVar83;
      auVar134._14_2_ = uVar38 >> uVar83;
      auVar70 = pabsw(auVar94,auVar91);
      uVar49 = auVar70._0_2_;
      auVar176._0_2_ = uVar49 >> uVar83;
      uVar57 = auVar70._2_2_;
      auVar176._2_2_ = uVar57 >> uVar83;
      uVar59 = auVar70._4_2_;
      auVar176._4_2_ = uVar59 >> uVar83;
      uVar61 = auVar70._6_2_;
      auVar176._6_2_ = uVar61 >> uVar83;
      uVar63 = auVar70._8_2_;
      auVar176._8_2_ = uVar63 >> uVar83;
      uVar65 = auVar70._10_2_;
      auVar176._10_2_ = uVar65 >> uVar83;
      uVar67 = auVar70._12_2_;
      uVar69 = auVar70._14_2_;
      auVar176._12_2_ = uVar67 >> uVar83;
      auVar176._14_2_ = uVar69 >> uVar83;
      auVar70 = psraw(auVar91,0xf);
      auVar86 = psubusw(auVar23,auVar134);
      auVar84 = psubusw(auVar23,auVar176);
      sVar68 = auVar86._0_2_;
      sVar100 = auVar86._2_2_;
      sVar111 = auVar86._4_2_;
      sVar112 = auVar86._6_2_;
      sVar113 = auVar86._8_2_;
      sVar114 = auVar86._10_2_;
      sVar115 = auVar86._12_2_;
      sVar116 = auVar86._14_2_;
      sVar47 = auVar84._0_2_;
      sVar48 = auVar84._2_2_;
      sVar56 = auVar84._4_2_;
      sVar58 = auVar84._6_2_;
      sVar60 = auVar84._8_2_;
      sVar62 = auVar84._10_2_;
      sVar64 = auVar84._12_2_;
      sVar66 = auVar84._14_2_;
      auVar156._0_2_ =
           (((short)uVar20 < sVar68) * uVar20 | (ushort)((short)uVar20 >= sVar68) * sVar68) +
           auVar148._0_2_;
      auVar156._2_2_ =
           (((short)uVar32 < sVar100) * uVar32 | (ushort)((short)uVar32 >= sVar100) * sVar100) +
           auVar148._2_2_;
      auVar156._4_2_ =
           (((short)uVar33 < sVar111) * uVar33 | (ushort)((short)uVar33 >= sVar111) * sVar111) +
           auVar148._4_2_;
      auVar156._6_2_ =
           (((short)uVar34 < sVar112) * uVar34 | (ushort)((short)uVar34 >= sVar112) * sVar112) +
           auVar148._6_2_;
      auVar156._8_2_ =
           (((short)uVar35 < sVar113) * uVar35 | (ushort)((short)uVar35 >= sVar113) * sVar113) +
           auVar148._8_2_;
      auVar156._10_2_ =
           (((short)uVar36 < sVar114) * uVar36 | (ushort)((short)uVar36 >= sVar114) * sVar114) +
           auVar148._10_2_;
      auVar156._12_2_ =
           (((short)uVar37 < sVar115) * uVar37 | (ushort)((short)uVar37 >= sVar115) * sVar115) +
           auVar148._12_2_;
      auVar156._14_2_ =
           (((short)uVar38 < sVar116) * uVar38 | (ushort)((short)uVar38 >= sVar116) * sVar116) +
           auVar148._14_2_;
      auVar135._0_2_ =
           (((short)uVar49 < sVar47) * uVar49 | (ushort)((short)uVar49 >= sVar47) * sVar47) +
           auVar70._0_2_;
      auVar135._2_2_ =
           (((short)uVar57 < sVar48) * uVar57 | (ushort)((short)uVar57 >= sVar48) * sVar48) +
           auVar70._2_2_;
      auVar135._4_2_ =
           (((short)uVar59 < sVar56) * uVar59 | (ushort)((short)uVar59 >= sVar56) * sVar56) +
           auVar70._4_2_;
      auVar135._6_2_ =
           (((short)uVar61 < sVar58) * uVar61 | (ushort)((short)uVar61 >= sVar58) * sVar58) +
           auVar70._6_2_;
      auVar135._8_2_ =
           (((short)uVar63 < sVar60) * uVar63 | (ushort)((short)uVar63 >= sVar60) * sVar60) +
           auVar70._8_2_;
      auVar135._10_2_ =
           (((short)uVar65 < sVar62) * uVar65 | (ushort)((short)uVar65 >= sVar62) * sVar62) +
           auVar70._10_2_;
      auVar135._12_2_ =
           (((short)uVar67 < sVar64) * uVar67 | (ushort)((short)uVar67 >= sVar64) * sVar64) +
           auVar70._12_2_;
      auVar135._14_2_ =
           (((short)uVar69 < sVar66) * uVar69 | (ushort)((short)uVar69 >= sVar66) * sVar66) +
           auVar70._14_2_;
      auVar156 = auVar156 ^ auVar148;
      auVar135 = auVar135 ^ auVar70;
      uVar3 = *(undefined8 *)(in + -lVar17);
      uVar4 = *(undefined8 *)(in + (0x90 - lVar17));
      uVar5 = *(undefined8 *)(in + (0x120 - lVar17));
      uVar6 = *(undefined8 *)(in + (0x1b0 - lVar17));
      auVar170._0_2_ = (short)uVar4 - sVar39;
      auVar170._2_2_ = (short)((ulong)uVar4 >> 0x10) - sVar40;
      auVar170._4_2_ = (short)((ulong)uVar4 >> 0x20) - sVar41;
      auVar170._6_2_ = (short)((ulong)uVar4 >> 0x30) - sVar42;
      auVar170._8_2_ = (short)uVar3 - sVar43;
      auVar170._10_2_ = (short)((ulong)uVar3 >> 0x10) - sVar44;
      auVar170._12_2_ = (short)((ulong)uVar3 >> 0x20) - sVar45;
      auVar170._14_2_ = (short)((ulong)uVar3 >> 0x30) - sVar46;
      auVar165._0_2_ = (short)uVar6 - sVar117;
      auVar165._2_2_ = (short)((ulong)uVar6 >> 0x10) - sVar141;
      auVar165._4_2_ = (short)((ulong)uVar6 >> 0x20) - sVar142;
      auVar165._6_2_ = (short)((ulong)uVar6 >> 0x30) - sVar143;
      auVar165._8_2_ = (short)uVar5 - sVar144;
      auVar165._10_2_ = (short)((ulong)uVar5 >> 0x10) - sVar145;
      auVar165._12_2_ = (short)((ulong)uVar5 >> 0x20) - sVar146;
      auVar165._14_2_ = (short)((ulong)uVar5 >> 0x30) - sVar147;
      auVar148 = pabsw(auVar176,auVar170);
      auVar70 = psraw(auVar170,0xf);
      uVar83 = (ulong)uVar15;
      uVar20 = auVar148._0_2_;
      auVar92._0_2_ = uVar20 >> uVar83;
      uVar32 = auVar148._2_2_;
      auVar92._2_2_ = uVar32 >> uVar83;
      uVar33 = auVar148._4_2_;
      auVar92._4_2_ = uVar33 >> uVar83;
      uVar34 = auVar148._6_2_;
      auVar92._6_2_ = uVar34 >> uVar83;
      uVar35 = auVar148._8_2_;
      auVar92._8_2_ = uVar35 >> uVar83;
      uVar36 = auVar148._10_2_;
      auVar92._10_2_ = uVar36 >> uVar83;
      uVar37 = auVar148._12_2_;
      uVar38 = auVar148._14_2_;
      auVar92._12_2_ = uVar37 >> uVar83;
      auVar92._14_2_ = uVar38 >> uVar83;
      auVar148 = pabsw(auVar50,auVar165);
      uVar49 = auVar148._0_2_;
      auVar183._0_2_ = uVar49 >> uVar83;
      uVar57 = auVar148._2_2_;
      auVar183._2_2_ = uVar57 >> uVar83;
      uVar59 = auVar148._4_2_;
      auVar183._4_2_ = uVar59 >> uVar83;
      uVar61 = auVar148._6_2_;
      auVar183._6_2_ = uVar61 >> uVar83;
      uVar63 = auVar148._8_2_;
      auVar183._8_2_ = uVar63 >> uVar83;
      uVar65 = auVar148._10_2_;
      auVar183._10_2_ = uVar65 >> uVar83;
      uVar67 = auVar148._12_2_;
      uVar69 = auVar148._14_2_;
      auVar183._12_2_ = uVar67 >> uVar83;
      auVar183._14_2_ = uVar69 >> uVar83;
      auVar86 = psraw(auVar165,0xf);
      auVar84 = psubusw(auVar23,auVar92);
      auVar148 = psubusw(auVar23,auVar183);
      sVar68 = auVar84._0_2_;
      sVar100 = auVar84._2_2_;
      sVar111 = auVar84._4_2_;
      sVar112 = auVar84._6_2_;
      sVar113 = auVar84._8_2_;
      sVar114 = auVar84._10_2_;
      sVar115 = auVar84._12_2_;
      sVar116 = auVar84._14_2_;
      sVar47 = auVar148._0_2_;
      sVar48 = auVar148._2_2_;
      sVar56 = auVar148._4_2_;
      sVar58 = auVar148._6_2_;
      sVar60 = auVar148._8_2_;
      sVar62 = auVar148._10_2_;
      sVar64 = auVar148._12_2_;
      sVar66 = auVar148._14_2_;
      auVar99._0_2_ =
           (((short)uVar20 < sVar68) * uVar20 | (ushort)((short)uVar20 >= sVar68) * sVar68) +
           auVar70._0_2_;
      auVar99._2_2_ =
           (((short)uVar32 < sVar100) * uVar32 | (ushort)((short)uVar32 >= sVar100) * sVar100) +
           auVar70._2_2_;
      auVar99._4_2_ =
           (((short)uVar33 < sVar111) * uVar33 | (ushort)((short)uVar33 >= sVar111) * sVar111) +
           auVar70._4_2_;
      auVar99._6_2_ =
           (((short)uVar34 < sVar112) * uVar34 | (ushort)((short)uVar34 >= sVar112) * sVar112) +
           auVar70._6_2_;
      auVar99._8_2_ =
           (((short)uVar35 < sVar113) * uVar35 | (ushort)((short)uVar35 >= sVar113) * sVar113) +
           auVar70._8_2_;
      auVar99._10_2_ =
           (((short)uVar36 < sVar114) * uVar36 | (ushort)((short)uVar36 >= sVar114) * sVar114) +
           auVar70._10_2_;
      auVar99._12_2_ =
           (((short)uVar37 < sVar115) * uVar37 | (ushort)((short)uVar37 >= sVar115) * sVar115) +
           auVar70._12_2_;
      auVar99._14_2_ =
           (((short)uVar38 < sVar116) * uVar38 | (ushort)((short)uVar38 >= sVar116) * sVar116) +
           auVar70._14_2_;
      auVar93._0_2_ =
           (((short)uVar49 < sVar47) * uVar49 | (ushort)((short)uVar49 >= sVar47) * sVar47) +
           auVar86._0_2_;
      auVar93._2_2_ =
           (((short)uVar57 < sVar48) * uVar57 | (ushort)((short)uVar57 >= sVar48) * sVar48) +
           auVar86._2_2_;
      auVar93._4_2_ =
           (((short)uVar59 < sVar56) * uVar59 | (ushort)((short)uVar59 >= sVar56) * sVar56) +
           auVar86._4_2_;
      auVar93._6_2_ =
           (((short)uVar61 < sVar58) * uVar61 | (ushort)((short)uVar61 >= sVar58) * sVar58) +
           auVar86._6_2_;
      auVar93._8_2_ =
           (((short)uVar63 < sVar60) * uVar63 | (ushort)((short)uVar63 >= sVar60) * sVar60) +
           auVar86._8_2_;
      auVar93._10_2_ =
           (((short)uVar65 < sVar62) * uVar65 | (ushort)((short)uVar65 >= sVar62) * sVar62) +
           auVar86._10_2_;
      auVar93._12_2_ =
           (((short)uVar67 < sVar64) * uVar67 | (ushort)((short)uVar67 >= sVar64) * sVar64) +
           auVar86._12_2_;
      auVar93._14_2_ =
           (((short)uVar69 < sVar66) * uVar69 | (ushort)((short)uVar69 >= sVar66) * sVar66) +
           auVar86._14_2_;
      auVar99 = auVar99 ^ auVar70;
      auVar93 = auVar93 ^ auVar86;
      uVar3 = *(undefined8 *)(in + lVar14);
      uVar4 = *(undefined8 *)(in + lVar14 + 0x90);
      uVar82 = *(ulong *)(in + lVar14 + 0x120);
      auVar84._8_8_ = 0;
      auVar84._0_8_ = uVar82;
      uVar5 = *(undefined8 *)(in + lVar14 + 0x1b0);
      auVar77._0_2_ = (short)uVar4 - sVar39;
      auVar77._2_2_ = (short)((ulong)uVar4 >> 0x10) - sVar40;
      auVar77._4_2_ = (short)((ulong)uVar4 >> 0x20) - sVar41;
      auVar77._6_2_ = (short)((ulong)uVar4 >> 0x30) - sVar42;
      auVar77._8_2_ = (short)uVar3 - sVar43;
      auVar77._10_2_ = (short)((ulong)uVar3 >> 0x10) - sVar44;
      auVar77._12_2_ = (short)((ulong)uVar3 >> 0x20) - sVar45;
      auVar77._14_2_ = (short)((ulong)uVar3 >> 0x30) - sVar46;
      auVar108._0_2_ = (short)uVar5 - sVar117;
      auVar108._2_2_ = (short)((ulong)uVar5 >> 0x10) - sVar141;
      auVar108._4_2_ = (short)((ulong)uVar5 >> 0x20) - sVar142;
      auVar108._6_2_ = (short)((ulong)uVar5 >> 0x30) - sVar143;
      auVar108._8_2_ = (short)uVar82 - sVar144;
      auVar108._10_2_ = (short)(uVar82 >> 0x10) - sVar145;
      auVar108._12_2_ = (short)(uVar82 >> 0x20) - sVar146;
      auVar108._14_2_ = (short)(uVar82 >> 0x30) - sVar147;
      auVar148 = pabsw(auVar84,auVar77);
      auVar70 = psraw(auVar77,0xf);
      uVar20 = auVar148._0_2_;
      auVar122._0_2_ = uVar20 >> uVar83;
      uVar32 = auVar148._2_2_;
      auVar122._2_2_ = uVar32 >> uVar83;
      uVar33 = auVar148._4_2_;
      auVar122._4_2_ = uVar33 >> uVar83;
      uVar34 = auVar148._6_2_;
      auVar122._6_2_ = uVar34 >> uVar83;
      uVar35 = auVar148._8_2_;
      auVar122._8_2_ = uVar35 >> uVar83;
      uVar36 = auVar148._10_2_;
      auVar122._10_2_ = uVar36 >> uVar83;
      uVar37 = auVar148._12_2_;
      uVar38 = auVar148._14_2_;
      auVar122._12_2_ = uVar37 >> uVar83;
      auVar122._14_2_ = uVar38 >> uVar83;
      auVar148 = pabsw(auVar86,auVar108);
      uVar49 = auVar148._0_2_;
      auVar177._0_2_ = uVar49 >> uVar83;
      uVar57 = auVar148._2_2_;
      auVar177._2_2_ = uVar57 >> uVar83;
      uVar59 = auVar148._4_2_;
      auVar177._4_2_ = uVar59 >> uVar83;
      uVar61 = auVar148._6_2_;
      auVar177._6_2_ = uVar61 >> uVar83;
      uVar63 = auVar148._8_2_;
      auVar177._8_2_ = uVar63 >> uVar83;
      uVar65 = auVar148._10_2_;
      auVar177._10_2_ = uVar65 >> uVar83;
      uVar67 = auVar148._12_2_;
      uVar69 = auVar148._14_2_;
      auVar177._12_2_ = uVar67 >> uVar83;
      auVar177._14_2_ = uVar69 >> uVar83;
      auVar148 = psraw(auVar108,0xf);
      auVar86 = psubusw(auVar23,auVar122);
      auVar84 = psubusw(auVar23,auVar177);
      sVar68 = auVar86._0_2_;
      sVar100 = auVar86._2_2_;
      sVar111 = auVar86._4_2_;
      sVar112 = auVar86._6_2_;
      sVar113 = auVar86._8_2_;
      sVar114 = auVar86._10_2_;
      sVar115 = auVar86._12_2_;
      sVar116 = auVar86._14_2_;
      sVar47 = auVar84._0_2_;
      sVar48 = auVar84._2_2_;
      sVar56 = auVar84._4_2_;
      sVar58 = auVar84._6_2_;
      sVar60 = auVar84._8_2_;
      sVar62 = auVar84._10_2_;
      sVar64 = auVar84._12_2_;
      sVar66 = auVar84._14_2_;
      auVar157._0_2_ =
           (((short)uVar20 < sVar68) * uVar20 | (ushort)((short)uVar20 >= sVar68) * sVar68) +
           auVar70._0_2_;
      auVar157._2_2_ =
           (((short)uVar32 < sVar100) * uVar32 | (ushort)((short)uVar32 >= sVar100) * sVar100) +
           auVar70._2_2_;
      auVar157._4_2_ =
           (((short)uVar33 < sVar111) * uVar33 | (ushort)((short)uVar33 >= sVar111) * sVar111) +
           auVar70._4_2_;
      auVar157._6_2_ =
           (((short)uVar34 < sVar112) * uVar34 | (ushort)((short)uVar34 >= sVar112) * sVar112) +
           auVar70._6_2_;
      auVar157._8_2_ =
           (((short)uVar35 < sVar113) * uVar35 | (ushort)((short)uVar35 >= sVar113) * sVar113) +
           auVar70._8_2_;
      auVar157._10_2_ =
           (((short)uVar36 < sVar114) * uVar36 | (ushort)((short)uVar36 >= sVar114) * sVar114) +
           auVar70._10_2_;
      auVar157._12_2_ =
           (((short)uVar37 < sVar115) * uVar37 | (ushort)((short)uVar37 >= sVar115) * sVar115) +
           auVar70._12_2_;
      auVar157._14_2_ =
           (((short)uVar38 < sVar116) * uVar38 | (ushort)((short)uVar38 >= sVar116) * sVar116) +
           auVar70._14_2_;
      auVar136._0_2_ =
           (((short)uVar49 < sVar47) * uVar49 | (ushort)((short)uVar49 >= sVar47) * sVar47) +
           auVar148._0_2_;
      auVar136._2_2_ =
           (((short)uVar57 < sVar48) * uVar57 | (ushort)((short)uVar57 >= sVar48) * sVar48) +
           auVar148._2_2_;
      auVar136._4_2_ =
           (((short)uVar59 < sVar56) * uVar59 | (ushort)((short)uVar59 >= sVar56) * sVar56) +
           auVar148._4_2_;
      auVar136._6_2_ =
           (((short)uVar61 < sVar58) * uVar61 | (ushort)((short)uVar61 >= sVar58) * sVar58) +
           auVar148._6_2_;
      auVar136._8_2_ =
           (((short)uVar63 < sVar60) * uVar63 | (ushort)((short)uVar63 >= sVar60) * sVar60) +
           auVar148._8_2_;
      auVar136._10_2_ =
           (((short)uVar65 < sVar62) * uVar65 | (ushort)((short)uVar65 >= sVar62) * sVar62) +
           auVar148._10_2_;
      auVar136._12_2_ =
           (((short)uVar67 < sVar64) * uVar67 | (ushort)((short)uVar67 >= sVar64) * sVar64) +
           auVar148._12_2_;
      auVar136._14_2_ =
           (((short)uVar69 < sVar66) * uVar69 | (ushort)((short)uVar69 >= sVar66) * sVar66) +
           auVar148._14_2_;
      auVar157 = auVar157 ^ auVar70;
      auVar136 = auVar136 ^ auVar148;
      uVar3 = *(undefined8 *)(in + -lVar14);
      uVar4 = *(undefined8 *)(in + (0x90 - lVar14));
      uVar82 = *(ulong *)(in + (0x120 - lVar14));
      auVar86._8_8_ = 0;
      auVar86._0_8_ = uVar82;
      uVar5 = *(undefined8 *)(in + (0x1b0 - lVar14));
      auVar78._0_2_ = (short)uVar4 - sVar39;
      auVar78._2_2_ = (short)((ulong)uVar4 >> 0x10) - sVar40;
      auVar78._4_2_ = (short)((ulong)uVar4 >> 0x20) - sVar41;
      auVar78._6_2_ = (short)((ulong)uVar4 >> 0x30) - sVar42;
      auVar78._8_2_ = (short)uVar3 - sVar43;
      auVar78._10_2_ = (short)((ulong)uVar3 >> 0x10) - sVar44;
      auVar78._12_2_ = (short)((ulong)uVar3 >> 0x20) - sVar45;
      auVar78._14_2_ = (short)((ulong)uVar3 >> 0x30) - sVar46;
      auVar166._0_2_ = (short)uVar5 - sVar117;
      auVar166._2_2_ = (short)((ulong)uVar5 >> 0x10) - sVar141;
      auVar166._4_2_ = (short)((ulong)uVar5 >> 0x20) - sVar142;
      auVar166._6_2_ = (short)((ulong)uVar5 >> 0x30) - sVar143;
      auVar166._8_2_ = (short)uVar82 - sVar144;
      auVar166._10_2_ = (short)(uVar82 >> 0x10) - sVar145;
      auVar166._12_2_ = (short)(uVar82 >> 0x20) - sVar146;
      auVar166._14_2_ = (short)(uVar82 >> 0x30) - sVar147;
      auVar148 = pabsw(auVar86,auVar78);
      auVar70 = psraw(auVar78,0xf);
      uVar20 = auVar148._0_2_;
      auVar109._0_2_ = uVar20 >> uVar83;
      uVar32 = auVar148._2_2_;
      auVar109._2_2_ = uVar32 >> uVar83;
      uVar33 = auVar148._4_2_;
      auVar109._4_2_ = uVar33 >> uVar83;
      uVar34 = auVar148._6_2_;
      auVar109._6_2_ = uVar34 >> uVar83;
      uVar35 = auVar148._8_2_;
      auVar109._8_2_ = uVar35 >> uVar83;
      uVar36 = auVar148._10_2_;
      auVar109._10_2_ = uVar36 >> uVar83;
      uVar37 = auVar148._12_2_;
      uVar38 = auVar148._14_2_;
      auVar109._12_2_ = uVar37 >> uVar83;
      auVar109._14_2_ = uVar38 >> uVar83;
      auVar148 = pabsw(auVar177,auVar166);
      uVar49 = auVar148._0_2_;
      auVar184._0_2_ = uVar49 >> uVar83;
      uVar57 = auVar148._2_2_;
      auVar184._2_2_ = uVar57 >> uVar83;
      uVar59 = auVar148._4_2_;
      auVar184._4_2_ = uVar59 >> uVar83;
      uVar61 = auVar148._6_2_;
      auVar184._6_2_ = uVar61 >> uVar83;
      uVar63 = auVar148._8_2_;
      auVar184._8_2_ = uVar63 >> uVar83;
      uVar65 = auVar148._10_2_;
      auVar184._10_2_ = uVar65 >> uVar83;
      uVar67 = auVar148._12_2_;
      uVar69 = auVar148._14_2_;
      auVar184._12_2_ = uVar67 >> uVar83;
      auVar184._14_2_ = uVar69 >> uVar83;
      auVar86 = psraw(auVar166,0xf);
      auVar84 = psubusw(auVar23,auVar109);
      auVar148 = psubusw(auVar23,auVar184);
      sVar68 = auVar84._0_2_;
      sVar100 = auVar84._2_2_;
      sVar111 = auVar84._4_2_;
      sVar112 = auVar84._6_2_;
      sVar113 = auVar84._8_2_;
      sVar114 = auVar84._10_2_;
      sVar115 = auVar84._12_2_;
      sVar116 = auVar84._14_2_;
      sVar47 = auVar148._0_2_;
      sVar48 = auVar148._2_2_;
      sVar56 = auVar148._4_2_;
      sVar58 = auVar148._6_2_;
      sVar60 = auVar148._8_2_;
      sVar62 = auVar148._10_2_;
      sVar64 = auVar148._12_2_;
      sVar66 = auVar148._14_2_;
      auVar123._0_2_ =
           (((short)uVar20 < sVar68) * uVar20 | (ushort)((short)uVar20 >= sVar68) * sVar68) +
           auVar70._0_2_;
      auVar123._2_2_ =
           (((short)uVar32 < sVar100) * uVar32 | (ushort)((short)uVar32 >= sVar100) * sVar100) +
           auVar70._2_2_;
      auVar123._4_2_ =
           (((short)uVar33 < sVar111) * uVar33 | (ushort)((short)uVar33 >= sVar111) * sVar111) +
           auVar70._4_2_;
      auVar123._6_2_ =
           (((short)uVar34 < sVar112) * uVar34 | (ushort)((short)uVar34 >= sVar112) * sVar112) +
           auVar70._6_2_;
      auVar123._8_2_ =
           (((short)uVar35 < sVar113) * uVar35 | (ushort)((short)uVar35 >= sVar113) * sVar113) +
           auVar70._8_2_;
      auVar123._10_2_ =
           (((short)uVar36 < sVar114) * uVar36 | (ushort)((short)uVar36 >= sVar114) * sVar114) +
           auVar70._10_2_;
      auVar123._12_2_ =
           (((short)uVar37 < sVar115) * uVar37 | (ushort)((short)uVar37 >= sVar115) * sVar115) +
           auVar70._12_2_;
      auVar123._14_2_ =
           (((short)uVar38 < sVar116) * uVar38 | (ushort)((short)uVar38 >= sVar116) * sVar116) +
           auVar70._14_2_;
      auVar110._0_2_ =
           (((short)uVar49 < sVar47) * uVar49 | (ushort)((short)uVar49 >= sVar47) * sVar47) +
           auVar86._0_2_;
      auVar110._2_2_ =
           (((short)uVar57 < sVar48) * uVar57 | (ushort)((short)uVar57 >= sVar48) * sVar48) +
           auVar86._2_2_;
      auVar110._4_2_ =
           (((short)uVar59 < sVar56) * uVar59 | (ushort)((short)uVar59 >= sVar56) * sVar56) +
           auVar86._4_2_;
      auVar110._6_2_ =
           (((short)uVar61 < sVar58) * uVar61 | (ushort)((short)uVar61 >= sVar58) * sVar58) +
           auVar86._6_2_;
      auVar110._8_2_ =
           (((short)uVar63 < sVar60) * uVar63 | (ushort)((short)uVar63 >= sVar60) * sVar60) +
           auVar86._8_2_;
      auVar110._10_2_ =
           (((short)uVar65 < sVar62) * uVar65 | (ushort)((short)uVar65 >= sVar62) * sVar62) +
           auVar86._10_2_;
      auVar110._12_2_ =
           (((short)uVar67 < sVar64) * uVar67 | (ushort)((short)uVar67 >= sVar64) * sVar64) +
           auVar86._12_2_;
      auVar110._14_2_ =
           (((short)uVar69 < sVar66) * uVar69 | (ushort)((short)uVar69 >= sVar66) * sVar66) +
           auVar86._14_2_;
      auVar123 = auVar123 ^ auVar70;
      in_XMM10._0_2_ = auVar123._0_2_ + auVar157._0_2_;
      in_XMM10._2_2_ = auVar123._2_2_ + auVar157._2_2_;
      in_XMM10._4_2_ = auVar123._4_2_ + auVar157._4_2_;
      in_XMM10._6_2_ = auVar123._6_2_ + auVar157._6_2_;
      in_XMM10._8_2_ = auVar123._8_2_ + auVar157._8_2_;
      in_XMM10._10_2_ = auVar123._10_2_ + auVar157._10_2_;
      in_XMM10._12_2_ = auVar123._12_2_ + auVar157._12_2_;
      in_XMM10._14_2_ = auVar123._14_2_ + auVar157._14_2_;
      auVar110 = auVar110 ^ auVar86;
      uVar3 = *(undefined8 *)(in + lVar19);
      uVar4 = *(undefined8 *)(in + lVar19 + 0x90);
      uVar82 = *(ulong *)(in + lVar19 + 0x120);
      auVar94._8_8_ = 0;
      auVar94._0_8_ = uVar82;
      uVar5 = *(undefined8 *)(in + lVar19 + 0x1b0);
      auVar79._0_2_ = (short)uVar4 - sVar39;
      auVar79._2_2_ = (short)((ulong)uVar4 >> 0x10) - sVar40;
      auVar79._4_2_ = (short)((ulong)uVar4 >> 0x20) - sVar41;
      auVar79._6_2_ = (short)((ulong)uVar4 >> 0x30) - sVar42;
      auVar79._8_2_ = (short)uVar3 - sVar43;
      auVar79._10_2_ = (short)((ulong)uVar3 >> 0x10) - sVar44;
      auVar79._12_2_ = (short)((ulong)uVar3 >> 0x20) - sVar45;
      auVar79._14_2_ = (short)((ulong)uVar3 >> 0x30) - sVar46;
      auVar137._0_2_ = (short)uVar5 - sVar117;
      auVar137._2_2_ = (short)((ulong)uVar5 >> 0x10) - sVar141;
      auVar137._4_2_ = (short)((ulong)uVar5 >> 0x20) - sVar142;
      auVar137._6_2_ = (short)((ulong)uVar5 >> 0x30) - sVar143;
      auVar137._8_2_ = (short)uVar82 - sVar144;
      auVar137._10_2_ = (short)(uVar82 >> 0x10) - sVar145;
      auVar137._12_2_ = (short)(uVar82 >> 0x20) - sVar146;
      auVar137._14_2_ = (short)(uVar82 >> 0x30) - sVar147;
      auVar148 = pabsw(auVar94,auVar79);
      auVar70 = psraw(auVar79,0xf);
      auVar86 = pabsw(auVar86,auVar137);
      auVar84 = psraw(auVar137,0xf);
      uVar20 = auVar148._0_2_;
      auVar158._0_2_ = uVar20 >> uVar83;
      uVar32 = auVar148._2_2_;
      auVar158._2_2_ = uVar32 >> uVar83;
      uVar33 = auVar148._4_2_;
      auVar158._4_2_ = uVar33 >> uVar83;
      uVar34 = auVar148._6_2_;
      auVar158._6_2_ = uVar34 >> uVar83;
      uVar35 = auVar148._8_2_;
      auVar158._8_2_ = uVar35 >> uVar83;
      uVar36 = auVar148._10_2_;
      auVar158._10_2_ = uVar36 >> uVar83;
      uVar37 = auVar148._12_2_;
      uVar38 = auVar148._14_2_;
      auVar158._12_2_ = uVar37 >> uVar83;
      auVar158._14_2_ = uVar38 >> uVar83;
      uVar49 = auVar86._0_2_;
      auVar185._0_2_ = uVar49 >> uVar83;
      uVar57 = auVar86._2_2_;
      auVar185._2_2_ = uVar57 >> uVar83;
      uVar59 = auVar86._4_2_;
      auVar185._4_2_ = uVar59 >> uVar83;
      uVar61 = auVar86._6_2_;
      auVar185._6_2_ = uVar61 >> uVar83;
      uVar63 = auVar86._8_2_;
      auVar185._8_2_ = uVar63 >> uVar83;
      uVar65 = auVar86._10_2_;
      auVar185._10_2_ = uVar65 >> uVar83;
      uVar67 = auVar86._12_2_;
      uVar69 = auVar86._14_2_;
      auVar185._12_2_ = uVar67 >> uVar83;
      auVar185._14_2_ = uVar69 >> uVar83;
      auVar86 = psubusw(auVar23,auVar158);
      auVar148 = psubusw(auVar23,auVar185);
      sVar68 = auVar86._0_2_;
      sVar100 = auVar86._2_2_;
      sVar111 = auVar86._4_2_;
      sVar112 = auVar86._6_2_;
      sVar113 = auVar86._8_2_;
      sVar114 = auVar86._10_2_;
      sVar115 = auVar86._12_2_;
      sVar116 = auVar86._14_2_;
      sVar47 = auVar148._0_2_;
      sVar48 = auVar148._2_2_;
      sVar56 = auVar148._4_2_;
      sVar58 = auVar148._6_2_;
      sVar60 = auVar148._8_2_;
      sVar62 = auVar148._10_2_;
      sVar64 = auVar148._12_2_;
      sVar66 = auVar148._14_2_;
      auVar178._0_2_ =
           (((short)uVar20 < sVar68) * uVar20 | (ushort)((short)uVar20 >= sVar68) * sVar68) +
           auVar70._0_2_;
      auVar178._2_2_ =
           (((short)uVar32 < sVar100) * uVar32 | (ushort)((short)uVar32 >= sVar100) * sVar100) +
           auVar70._2_2_;
      auVar178._4_2_ =
           (((short)uVar33 < sVar111) * uVar33 | (ushort)((short)uVar33 >= sVar111) * sVar111) +
           auVar70._4_2_;
      auVar178._6_2_ =
           (((short)uVar34 < sVar112) * uVar34 | (ushort)((short)uVar34 >= sVar112) * sVar112) +
           auVar70._6_2_;
      auVar178._8_2_ =
           (((short)uVar35 < sVar113) * uVar35 | (ushort)((short)uVar35 >= sVar113) * sVar113) +
           auVar70._8_2_;
      auVar178._10_2_ =
           (((short)uVar36 < sVar114) * uVar36 | (ushort)((short)uVar36 >= sVar114) * sVar114) +
           auVar70._10_2_;
      auVar178._12_2_ =
           (((short)uVar37 < sVar115) * uVar37 | (ushort)((short)uVar37 >= sVar115) * sVar115) +
           auVar70._12_2_;
      auVar178._14_2_ =
           (((short)uVar38 < sVar116) * uVar38 | (ushort)((short)uVar38 >= sVar116) * sVar116) +
           auVar70._14_2_;
      auVar159._0_2_ =
           (((short)uVar49 < sVar47) * uVar49 | (ushort)((short)uVar49 >= sVar47) * sVar47) +
           auVar84._0_2_;
      auVar159._2_2_ =
           (((short)uVar57 < sVar48) * uVar57 | (ushort)((short)uVar57 >= sVar48) * sVar48) +
           auVar84._2_2_;
      auVar159._4_2_ =
           (((short)uVar59 < sVar56) * uVar59 | (ushort)((short)uVar59 >= sVar56) * sVar56) +
           auVar84._4_2_;
      auVar159._6_2_ =
           (((short)uVar61 < sVar58) * uVar61 | (ushort)((short)uVar61 >= sVar58) * sVar58) +
           auVar84._6_2_;
      auVar159._8_2_ =
           (((short)uVar63 < sVar60) * uVar63 | (ushort)((short)uVar63 >= sVar60) * sVar60) +
           auVar84._8_2_;
      auVar159._10_2_ =
           (((short)uVar65 < sVar62) * uVar65 | (ushort)((short)uVar65 >= sVar62) * sVar62) +
           auVar84._10_2_;
      auVar159._12_2_ =
           (((short)uVar67 < sVar64) * uVar67 | (ushort)((short)uVar67 >= sVar64) * sVar64) +
           auVar84._12_2_;
      auVar159._14_2_ =
           (((short)uVar69 < sVar66) * uVar69 | (ushort)((short)uVar69 >= sVar66) * sVar66) +
           auVar84._14_2_;
      auVar178 = auVar178 ^ auVar70;
      uVar3 = *(undefined8 *)(in + -lVar19);
      uVar4 = *(undefined8 *)(in + (0x90 - lVar19));
      uVar5 = *(undefined8 *)(in + (0x120 - lVar19));
      uVar6 = *(undefined8 *)(in + (0x1b0 - lVar19));
      auVar80._0_2_ = (short)uVar4 - sVar39;
      auVar80._2_2_ = (short)((ulong)uVar4 >> 0x10) - sVar40;
      auVar80._4_2_ = (short)((ulong)uVar4 >> 0x20) - sVar41;
      auVar80._6_2_ = (short)((ulong)uVar4 >> 0x30) - sVar42;
      auVar80._8_2_ = (short)uVar3 - sVar43;
      auVar80._10_2_ = (short)((ulong)uVar3 >> 0x10) - sVar44;
      auVar80._12_2_ = (short)((ulong)uVar3 >> 0x20) - sVar45;
      auVar80._14_2_ = (short)((ulong)uVar3 >> 0x30) - sVar46;
      auVar186._0_2_ = (short)uVar6 - sVar117;
      auVar186._2_2_ = (short)((ulong)uVar6 >> 0x10) - sVar141;
      auVar186._4_2_ = (short)((ulong)uVar6 >> 0x20) - sVar142;
      auVar186._6_2_ = (short)((ulong)uVar6 >> 0x30) - sVar143;
      auVar186._8_2_ = (short)uVar5 - sVar144;
      auVar186._10_2_ = (short)((ulong)uVar5 >> 0x10) - sVar145;
      auVar186._12_2_ = (short)((ulong)uVar5 >> 0x20) - sVar146;
      auVar186._14_2_ = (short)((ulong)uVar5 >> 0x30) - sVar147;
      auVar148 = pabsw(auVar50,auVar80);
      uVar82 = (ulong)uVar15;
      uVar49 = auVar148._0_2_;
      auVar118._0_2_ = uVar49 >> uVar82;
      uVar57 = auVar148._2_2_;
      auVar118._2_2_ = uVar57 >> uVar82;
      uVar59 = auVar148._4_2_;
      auVar118._4_2_ = uVar59 >> uVar82;
      uVar61 = auVar148._6_2_;
      auVar118._6_2_ = uVar61 >> uVar82;
      uVar63 = auVar148._8_2_;
      auVar118._8_2_ = uVar63 >> uVar82;
      uVar65 = auVar148._10_2_;
      auVar118._10_2_ = uVar65 >> uVar82;
      uVar67 = auVar148._12_2_;
      uVar69 = auVar148._14_2_;
      auVar118._12_2_ = uVar67 >> uVar82;
      auVar118._14_2_ = uVar69 >> uVar82;
      in_XMM5 = pabsw(in_XMM5,auVar186);
      uVar20 = in_XMM5._0_2_;
      auVar70._0_2_ = uVar20 >> uVar82;
      uVar32 = in_XMM5._2_2_;
      auVar70._2_2_ = uVar32 >> uVar82;
      uVar33 = in_XMM5._4_2_;
      auVar70._4_2_ = uVar33 >> uVar82;
      uVar34 = in_XMM5._6_2_;
      auVar70._6_2_ = uVar34 >> uVar82;
      uVar35 = in_XMM5._8_2_;
      auVar70._8_2_ = uVar35 >> uVar82;
      uVar36 = in_XMM5._10_2_;
      auVar70._10_2_ = uVar36 >> uVar82;
      uVar37 = in_XMM5._12_2_;
      uVar38 = in_XMM5._14_2_;
      auVar70._12_2_ = uVar37 >> uVar82;
      auVar70._14_2_ = uVar38 >> uVar82;
      auVar159 = auVar159 ^ auVar84;
      auVar50 = psubusw(auVar23,auVar118);
      auVar148 = psubusw(auVar23,auVar70);
      sVar68 = auVar50._0_2_;
      sVar100 = auVar50._2_2_;
      sVar111 = auVar50._4_2_;
      sVar112 = auVar50._6_2_;
      sVar113 = auVar50._8_2_;
      sVar114 = auVar50._10_2_;
      sVar115 = auVar50._12_2_;
      sVar116 = auVar50._14_2_;
      sVar47 = auVar148._0_2_;
      sVar48 = auVar148._2_2_;
      sVar56 = auVar148._4_2_;
      sVar58 = auVar148._6_2_;
      sVar60 = auVar148._8_2_;
      sVar62 = auVar148._10_2_;
      sVar64 = auVar148._12_2_;
      sVar66 = auVar148._14_2_;
      auVar148 = psraw(auVar80,0xf);
      auVar167._0_2_ =
           (((short)uVar49 < sVar68) * uVar49 | (ushort)((short)uVar49 >= sVar68) * sVar68) +
           auVar148._0_2_;
      auVar167._2_2_ =
           (((short)uVar57 < sVar100) * uVar57 | (ushort)((short)uVar57 >= sVar100) * sVar100) +
           auVar148._2_2_;
      auVar167._4_2_ =
           (((short)uVar59 < sVar111) * uVar59 | (ushort)((short)uVar59 >= sVar111) * sVar111) +
           auVar148._4_2_;
      auVar167._6_2_ =
           (((short)uVar61 < sVar112) * uVar61 | (ushort)((short)uVar61 >= sVar112) * sVar112) +
           auVar148._6_2_;
      auVar167._8_2_ =
           (((short)uVar63 < sVar113) * uVar63 | (ushort)((short)uVar63 >= sVar113) * sVar113) +
           auVar148._8_2_;
      auVar167._10_2_ =
           (((short)uVar65 < sVar114) * uVar65 | (ushort)((short)uVar65 >= sVar114) * sVar114) +
           auVar148._10_2_;
      auVar167._12_2_ =
           (((short)uVar67 < sVar115) * uVar67 | (ushort)((short)uVar67 >= sVar115) * sVar115) +
           auVar148._12_2_;
      auVar167._14_2_ =
           (((short)uVar69 < sVar116) * uVar69 | (ushort)((short)uVar69 >= sVar116) * sVar116) +
           auVar148._14_2_;
      auVar167 = auVar167 ^ auVar148;
      auVar148 = psraw(auVar186,0xf);
      auVar138._0_2_ =
           (((short)uVar20 < sVar47) * uVar20 | (ushort)((short)uVar20 >= sVar47) * sVar47) +
           auVar148._0_2_;
      auVar138._2_2_ =
           (((short)uVar32 < sVar48) * uVar32 | (ushort)((short)uVar32 >= sVar48) * sVar48) +
           auVar148._2_2_;
      auVar138._4_2_ =
           (((short)uVar33 < sVar56) * uVar33 | (ushort)((short)uVar33 >= sVar56) * sVar56) +
           auVar148._4_2_;
      auVar138._6_2_ =
           (((short)uVar34 < sVar58) * uVar34 | (ushort)((short)uVar34 >= sVar58) * sVar58) +
           auVar148._6_2_;
      auVar138._8_2_ =
           (((short)uVar35 < sVar60) * uVar35 | (ushort)((short)uVar35 >= sVar60) * sVar60) +
           auVar148._8_2_;
      auVar138._10_2_ =
           (((short)uVar36 < sVar62) * uVar36 | (ushort)((short)uVar36 >= sVar62) * sVar62) +
           auVar148._10_2_;
      auVar138._12_2_ =
           (((short)uVar37 < sVar64) * uVar37 | (ushort)((short)uVar37 >= sVar64) * sVar64) +
           auVar148._12_2_;
      auVar138._14_2_ =
           (((short)uVar38 < sVar66) * uVar38 | (ushort)((short)uVar38 >= sVar66) * sVar66) +
           auVar148._14_2_;
      auVar138 = auVar138 ^ auVar148;
      local_78 = auVar101._0_2_;
      sStack_76 = auVar101._2_2_;
      auVar148._4_2_ = sStack_84;
      auVar148._0_4_ = auVar125._0_4_;
      auVar148._6_2_ = sStack_82;
      auVar148._8_2_ = sStack_84;
      auVar148._10_2_ = sStack_82;
      auVar148._12_2_ = sStack_84;
      auVar148._14_2_ = sStack_82;
      auVar168._0_2_ =
           (auVar167._0_2_ + auVar178._0_2_ + in_XMM10._0_2_) * sStack_84 +
           (auVar99._0_2_ + auVar156._0_2_ + auVar121._0_2_ + auVar97._0_2_) * local_78;
      auVar168._2_2_ =
           (auVar167._2_2_ + auVar178._2_2_ + in_XMM10._2_2_) * sStack_82 +
           (auVar99._2_2_ + auVar156._2_2_ + auVar121._2_2_ + auVar97._2_2_) * sStack_76;
      auVar168._4_2_ =
           (auVar167._4_2_ + auVar178._4_2_ + in_XMM10._4_2_) * sStack_84 +
           (auVar99._4_2_ + auVar156._4_2_ + auVar121._4_2_ + auVar97._4_2_) * local_78;
      auVar168._6_2_ =
           (auVar167._6_2_ + auVar178._6_2_ + in_XMM10._6_2_) * sStack_82 +
           (auVar99._6_2_ + auVar156._6_2_ + auVar121._6_2_ + auVar97._6_2_) * sStack_76;
      auVar168._8_2_ =
           (auVar167._8_2_ + auVar178._8_2_ + in_XMM10._8_2_) * sStack_84 +
           (auVar99._8_2_ + auVar156._8_2_ + auVar121._8_2_ + auVar97._8_2_) * local_78;
      auVar168._10_2_ =
           (auVar167._10_2_ + auVar178._10_2_ + in_XMM10._10_2_) * sStack_82 +
           (auVar99._10_2_ + auVar156._10_2_ + auVar121._10_2_ + auVar97._10_2_) * sStack_76;
      auVar168._12_2_ =
           (auVar167._12_2_ + auVar178._12_2_ + in_XMM10._12_2_) * sStack_84 +
           (auVar99._12_2_ + auVar156._12_2_ + auVar121._12_2_ + auVar97._12_2_) * local_78;
      auVar168._14_2_ =
           (auVar167._14_2_ + auVar178._14_2_ + in_XMM10._14_2_) * sStack_82 +
           (auVar99._14_2_ + auVar156._14_2_ + auVar121._14_2_ + auVar97._14_2_) * sStack_76;
      auVar139._0_2_ =
           (auVar138._0_2_ + auVar159._0_2_ + auVar110._0_2_ + auVar136._0_2_) * sStack_84 +
           (auVar93._0_2_ + auVar135._0_2_ + auVar107._0_2_ + auVar90._0_2_) * local_78;
      auVar139._2_2_ =
           (auVar138._2_2_ + auVar159._2_2_ + auVar110._2_2_ + auVar136._2_2_) * sStack_82 +
           (auVar93._2_2_ + auVar135._2_2_ + auVar107._2_2_ + auVar90._2_2_) * sStack_76;
      auVar139._4_2_ =
           (auVar138._4_2_ + auVar159._4_2_ + auVar110._4_2_ + auVar136._4_2_) * sStack_84 +
           (auVar93._4_2_ + auVar135._4_2_ + auVar107._4_2_ + auVar90._4_2_) * local_78;
      auVar139._6_2_ =
           (auVar138._6_2_ + auVar159._6_2_ + auVar110._6_2_ + auVar136._6_2_) * sStack_82 +
           (auVar93._6_2_ + auVar135._6_2_ + auVar107._6_2_ + auVar90._6_2_) * sStack_76;
      auVar139._8_2_ =
           (auVar138._8_2_ + auVar159._8_2_ + auVar110._8_2_ + auVar136._8_2_) * sStack_84 +
           (auVar93._8_2_ + auVar135._8_2_ + auVar107._8_2_ + auVar90._8_2_) * local_78;
      auVar139._10_2_ =
           (auVar138._10_2_ + auVar159._10_2_ + auVar110._10_2_ + auVar136._10_2_) * sStack_82 +
           (auVar93._10_2_ + auVar135._10_2_ + auVar107._10_2_ + auVar90._10_2_) * sStack_76;
      auVar139._12_2_ =
           (auVar138._12_2_ + auVar159._12_2_ + auVar110._12_2_ + auVar136._12_2_) * sStack_84 +
           (auVar93._12_2_ + auVar135._12_2_ + auVar107._12_2_ + auVar90._12_2_) * local_78;
      auVar139._14_2_ =
           (auVar138._14_2_ + auVar159._14_2_ + auVar110._14_2_ + auVar136._14_2_) * sStack_82 +
           (auVar93._14_2_ + auVar135._14_2_ + auVar107._14_2_ + auVar90._14_2_) * sStack_76;
      auVar50 = psraw(auVar168,0xf);
      auVar70 = pmovsxbw(auVar148,0x808080808080808);
      auVar169._0_2_ = auVar168._0_2_ + auVar70._0_2_ + auVar50._0_2_;
      auVar169._2_2_ = auVar168._2_2_ + auVar70._2_2_ + auVar50._2_2_;
      auVar169._4_2_ = auVar168._4_2_ + auVar70._4_2_ + auVar50._4_2_;
      auVar169._6_2_ = auVar168._6_2_ + auVar70._6_2_ + auVar50._6_2_;
      auVar169._8_2_ = auVar168._8_2_ + auVar70._8_2_ + auVar50._8_2_;
      auVar169._10_2_ = auVar168._10_2_ + auVar70._10_2_ + auVar50._10_2_;
      auVar169._12_2_ = auVar168._12_2_ + auVar70._12_2_ + auVar50._12_2_;
      auVar169._14_2_ = auVar168._14_2_ + auVar70._14_2_ + auVar50._14_2_;
      auVar148 = psraw(auVar139,0xf);
      auVar140._0_2_ = auVar139._0_2_ + auVar70._0_2_ + auVar148._0_2_;
      auVar140._2_2_ = auVar139._2_2_ + auVar70._2_2_ + auVar148._2_2_;
      auVar140._4_2_ = auVar139._4_2_ + auVar70._4_2_ + auVar148._4_2_;
      auVar140._6_2_ = auVar139._6_2_ + auVar70._6_2_ + auVar148._6_2_;
      auVar140._8_2_ = auVar139._8_2_ + auVar70._8_2_ + auVar148._8_2_;
      auVar140._10_2_ = auVar139._10_2_ + auVar70._10_2_ + auVar148._10_2_;
      auVar140._12_2_ = auVar139._12_2_ + auVar70._12_2_ + auVar148._12_2_;
      auVar140._14_2_ = auVar139._14_2_ + auVar70._14_2_ + auVar148._14_2_;
      auVar148 = psraw(auVar169,4);
      in_XMM13._0_2_ = auVar148._0_2_ + sVar39;
      in_XMM13._2_2_ = auVar148._2_2_ + sVar40;
      in_XMM13._4_2_ = auVar148._4_2_ + sVar41;
      in_XMM13._6_2_ = auVar148._6_2_ + sVar42;
      in_XMM13._8_2_ = auVar148._8_2_ + sVar43;
      in_XMM13._10_2_ = auVar148._10_2_ + sVar44;
      in_XMM13._12_2_ = auVar148._12_2_ + sVar45;
      in_XMM13._14_2_ = auVar148._14_2_ + sVar46;
      auVar148 = psraw(auVar140,4);
      sVar117 = auVar148._0_2_ + sVar117;
      sVar141 = auVar148._2_2_ + sVar141;
      sVar142 = auVar148._4_2_ + sVar142;
      sVar143 = auVar148._6_2_ + sVar143;
      sVar144 = auVar148._8_2_ + sVar144;
      sVar145 = auVar148._10_2_ + sVar145;
      sVar146 = auVar148._12_2_ + sVar146;
      sVar147 = auVar148._14_2_ + sVar147;
      uVar21 = CONCAT13((0 < sVar143) * (sVar143 < 0x100) * (char)sVar143 - (0xff < sVar143),
                        CONCAT12((0 < sVar142) * (sVar142 < 0x100) * (char)sVar142 -
                                 (0xff < sVar142),
                                 CONCAT11((0 < sVar141) * (sVar141 < 0x100) * (char)sVar141 -
                                          (0xff < sVar141),
                                          (0 < sVar117) * (sVar117 < 0x100) * (char)sVar117 -
                                          (0xff < sVar117))));
      auVar124._0_8_ =
           CONCAT17((0 < sVar147) * (sVar147 < 0x100) * (char)sVar147 - (0xff < sVar147),
                    CONCAT16((0 < sVar146) * (sVar146 < 0x100) * (char)sVar146 - (0xff < sVar146),
                             CONCAT15((0 < sVar145) * (sVar145 < 0x100) * (char)sVar145 -
                                      (0xff < sVar145),
                                      CONCAT14((0 < sVar144) * (sVar144 < 0x100) * (char)sVar144 -
                                               (0xff < sVar144),uVar21))));
      auVar124[8] = (0 < in_XMM13._0_2_) * (in_XMM13._0_2_ < 0x100) * (char)in_XMM13._0_2_ -
                    (0xff < in_XMM13._0_2_);
      auVar124[9] = (0 < in_XMM13._2_2_) * (in_XMM13._2_2_ < 0x100) * (char)in_XMM13._2_2_ -
                    (0xff < in_XMM13._2_2_);
      auVar124[10] = (0 < in_XMM13._4_2_) * (in_XMM13._4_2_ < 0x100) * (char)in_XMM13._4_2_ -
                     (0xff < in_XMM13._4_2_);
      auVar124[0xb] =
           (0 < in_XMM13._6_2_) * (in_XMM13._6_2_ < 0x100) * (char)in_XMM13._6_2_ -
           (0xff < in_XMM13._6_2_);
      in_XMM11[0xc] =
           (0 < in_XMM13._8_2_) * (in_XMM13._8_2_ < 0x100) * (char)in_XMM13._8_2_ -
           (0xff < in_XMM13._8_2_);
      in_XMM11._0_12_ = auVar124;
      in_XMM11[0xd] =
           (0 < in_XMM13._10_2_) * (in_XMM13._10_2_ < 0x100) * (char)in_XMM13._10_2_ -
           (0xff < in_XMM13._10_2_);
      in_XMM11[0xe] =
           (0 < in_XMM13._12_2_) * (in_XMM13._12_2_ < 0x100) * (char)in_XMM13._12_2_ -
           (0xff < in_XMM13._12_2_);
      in_XMM11[0xf] =
           (0 < in_XMM13._14_2_) * (in_XMM13._14_2_ < 0x100) * (char)in_XMM13._14_2_ -
           (0xff < in_XMM13._14_2_);
      *(int *)dest = in_XMM11._12_4_;
      *(int *)((long)dest + lVar16) = auVar124._8_4_;
      *(int *)((long)dest + lVar16 * 2) = (int)((ulong)auVar124._0_8_ >> 0x20);
      *(undefined4 *)((long)dest + lVar16 * 3) = uVar21;
      dest = (void *)((long)dest + lVar16 * 4);
      in = in + 0x240;
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_8_2)(void *dest, int dstride, const uint16_t *in,
                                int pri_strength, int sec_strength, int dir,
                                int pri_damping, int sec_damping,
                                int coeff_shift, int block_width,
                                int block_height) {
  if (block_width == 8) {
    filter_block_8x8(/*is_lowbd=*/1, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/0,
                     /*enable_secondary=*/1);
  } else {
    filter_block_4x4(/*is_lowbd=*/1, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/0,
                     /*enable_secondary=*/1);
  }
}